

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  int iVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  RayK<4> *pRVar81;
  byte bVar82;
  ulong uVar83;
  bool bVar84;
  ulong uVar85;
  uint uVar86;
  ulong uVar87;
  Geometry *geometry;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  long lVar88;
  ulong uVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar138;
  float fVar139;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar95 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar96 [16];
  float fVar140;
  float fVar142;
  float fVar143;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar141;
  float fVar144;
  float fVar145;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar146;
  undefined4 uVar147;
  undefined8 uVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [64];
  float fVar158;
  float fVar159;
  float fVar166;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar167;
  float fVar172;
  float fVar173;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  bool local_6f9;
  undefined8 local_680;
  undefined8 uStack_678;
  ulong local_668;
  RTCFilterFunctionNArguments local_660;
  undefined1 local_630 [16];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined4 local_610;
  undefined4 uStack_60c;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  LinearSpace3fa *local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_450 [16];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  int local_31c;
  undefined1 local_310 [16];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  byte local_2d0;
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  uint local_240;
  uint uStack_23c;
  uint uStack_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint uStack_228;
  uint uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar89 = (ulong)(byte)PVar12;
  fVar167 = *(float *)(prim + uVar89 * 0x19 + 0x12);
  auVar23 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar156 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar95 = vsubps_avx(auVar23,*(undefined1 (*) [16])(prim + uVar89 * 0x19 + 6));
  fVar158 = fVar167 * auVar95._0_4_;
  fVar146 = fVar167 * auVar156._0_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar89 * 4 + 6);
  auVar105 = vpmovsxbd_avx2(auVar23);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar89 * 5 + 6);
  auVar103 = vpmovsxbd_avx2(auVar94);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar89 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar93);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar89 * 0xb + 6);
  auVar118 = vpmovsxbd_avx2(auVar197);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar117 = vpmovsxbd_avx2(auVar8);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar89 + 6);
  auVar116 = vpmovsxbd_avx2(auVar9);
  auVar116 = vcvtdq2ps_avx(auVar116);
  uVar87 = (ulong)(uint)((int)(uVar89 * 9) * 2);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar87 + 6);
  auVar106 = vpmovsxbd_avx2(auVar92);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar87 + uVar89 + 6);
  auVar115 = vpmovsxbd_avx2(auVar10);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar107 = vcvtdq2ps_avx(auVar115);
  uVar85 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar101 = vpmovsxbd_avx2(auVar11);
  auVar108 = vcvtdq2ps_avx(auVar101);
  auVar188._4_4_ = fVar146;
  auVar188._0_4_ = fVar146;
  auVar188._8_4_ = fVar146;
  auVar188._12_4_ = fVar146;
  auVar188._16_4_ = fVar146;
  auVar188._20_4_ = fVar146;
  auVar188._24_4_ = fVar146;
  auVar188._28_4_ = fVar146;
  auVar191._8_4_ = 1;
  auVar191._0_8_ = 0x100000001;
  auVar191._12_4_ = 1;
  auVar191._16_4_ = 1;
  auVar191._20_4_ = 1;
  auVar191._24_4_ = 1;
  auVar191._28_4_ = 1;
  auVar109 = ZEXT1632(CONCAT412(fVar167 * auVar156._12_4_,
                                CONCAT48(fVar167 * auVar156._8_4_,
                                         CONCAT44(fVar167 * auVar156._4_4_,fVar146))));
  auVar102 = vpermps_avx2(auVar191,auVar109);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar100 = vpermps_avx512vl(auVar99,auVar109);
  fVar146 = auVar100._0_4_;
  fVar172 = auVar100._4_4_;
  auVar109._4_4_ = fVar172 * auVar104._4_4_;
  auVar109._0_4_ = fVar146 * auVar104._0_4_;
  fVar173 = auVar100._8_4_;
  auVar109._8_4_ = fVar173 * auVar104._8_4_;
  fVar159 = auVar100._12_4_;
  auVar109._12_4_ = fVar159 * auVar104._12_4_;
  fVar166 = auVar100._16_4_;
  auVar109._16_4_ = fVar166 * auVar104._16_4_;
  fVar90 = auVar100._20_4_;
  auVar109._20_4_ = fVar90 * auVar104._20_4_;
  fVar91 = auVar100._24_4_;
  auVar109._24_4_ = fVar91 * auVar104._24_4_;
  auVar109._28_4_ = auVar115._28_4_;
  auVar115._4_4_ = auVar116._4_4_ * fVar172;
  auVar115._0_4_ = auVar116._0_4_ * fVar146;
  auVar115._8_4_ = auVar116._8_4_ * fVar173;
  auVar115._12_4_ = auVar116._12_4_ * fVar159;
  auVar115._16_4_ = auVar116._16_4_ * fVar166;
  auVar115._20_4_ = auVar116._20_4_ * fVar90;
  auVar115._24_4_ = auVar116._24_4_ * fVar91;
  auVar115._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar108._4_4_ * fVar172;
  auVar101._0_4_ = auVar108._0_4_ * fVar146;
  auVar101._8_4_ = auVar108._8_4_ * fVar173;
  auVar101._12_4_ = auVar108._12_4_ * fVar159;
  auVar101._16_4_ = auVar108._16_4_ * fVar166;
  auVar101._20_4_ = auVar108._20_4_ * fVar90;
  auVar101._24_4_ = auVar108._24_4_ * fVar91;
  auVar101._28_4_ = auVar100._28_4_;
  auVar23 = vfmadd231ps_fma(auVar109,auVar102,auVar103);
  auVar94 = vfmadd231ps_fma(auVar115,auVar102,auVar117);
  auVar93 = vfmadd231ps_fma(auVar101,auVar107,auVar102);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar188,auVar105);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar188,auVar118);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar106,auVar188);
  auVar189._4_4_ = fVar158;
  auVar189._0_4_ = fVar158;
  auVar189._8_4_ = fVar158;
  auVar189._12_4_ = fVar158;
  auVar189._16_4_ = fVar158;
  auVar189._20_4_ = fVar158;
  auVar189._24_4_ = fVar158;
  auVar189._28_4_ = fVar158;
  auVar101 = ZEXT1632(CONCAT412(fVar167 * auVar95._12_4_,
                                CONCAT48(fVar167 * auVar95._8_4_,
                                         CONCAT44(fVar167 * auVar95._4_4_,fVar158))));
  auVar115 = vpermps_avx2(auVar191,auVar101);
  auVar101 = vpermps_avx512vl(auVar99,auVar101);
  auVar102 = vmulps_avx512vl(auVar101,auVar104);
  auVar111._0_4_ = auVar101._0_4_ * auVar116._0_4_;
  auVar111._4_4_ = auVar101._4_4_ * auVar116._4_4_;
  auVar111._8_4_ = auVar101._8_4_ * auVar116._8_4_;
  auVar111._12_4_ = auVar101._12_4_ * auVar116._12_4_;
  auVar111._16_4_ = auVar101._16_4_ * auVar116._16_4_;
  auVar111._20_4_ = auVar101._20_4_ * auVar116._20_4_;
  auVar111._24_4_ = auVar101._24_4_ * auVar116._24_4_;
  auVar111._28_4_ = 0;
  auVar116._4_4_ = auVar101._4_4_ * auVar108._4_4_;
  auVar116._0_4_ = auVar101._0_4_ * auVar108._0_4_;
  auVar116._8_4_ = auVar101._8_4_ * auVar108._8_4_;
  auVar116._12_4_ = auVar101._12_4_ * auVar108._12_4_;
  auVar116._16_4_ = auVar101._16_4_ * auVar108._16_4_;
  auVar116._20_4_ = auVar101._20_4_ * auVar108._20_4_;
  auVar116._24_4_ = auVar101._24_4_ * auVar108._24_4_;
  auVar116._28_4_ = auVar104._28_4_;
  auVar103 = vfmadd231ps_avx512vl(auVar102,auVar115,auVar103);
  auVar197 = vfmadd231ps_fma(auVar111,auVar115,auVar117);
  auVar8 = vfmadd231ps_fma(auVar116,auVar115,auVar107);
  auVar103 = vfmadd231ps_avx512vl(auVar103,auVar189,auVar105);
  auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar189,auVar118);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar189,auVar106);
  auVar180._8_4_ = 0x7fffffff;
  auVar180._0_8_ = 0x7fffffff7fffffff;
  auVar180._12_4_ = 0x7fffffff;
  auVar180._16_4_ = 0x7fffffff;
  auVar180._20_4_ = 0x7fffffff;
  auVar180._24_4_ = 0x7fffffff;
  auVar180._28_4_ = 0x7fffffff;
  auVar105 = vandps_avx(ZEXT1632(auVar23),auVar180);
  auVar113._8_4_ = 0x219392ef;
  auVar113._0_8_ = 0x219392ef219392ef;
  auVar113._12_4_ = 0x219392ef;
  auVar113._16_4_ = 0x219392ef;
  auVar113._20_4_ = 0x219392ef;
  auVar113._24_4_ = 0x219392ef;
  auVar113._28_4_ = 0x219392ef;
  uVar87 = vcmpps_avx512vl(auVar105,auVar113,1);
  bVar84 = (bool)((byte)uVar87 & 1);
  auVar102._0_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar23._0_4_;
  bVar84 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar23._4_4_;
  bVar84 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar23._8_4_;
  bVar84 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar23._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar94),auVar180);
  uVar87 = vcmpps_avx512vl(auVar105,auVar113,1);
  bVar84 = (bool)((byte)uVar87 & 1);
  auVar99._0_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar94._0_4_;
  bVar84 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar94._4_4_;
  bVar84 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar94._8_4_;
  bVar84 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar94._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar105 = vandps_avx(ZEXT1632(auVar93),auVar180);
  uVar87 = vcmpps_avx512vl(auVar105,auVar113,1);
  bVar84 = (bool)((byte)uVar87 & 1);
  auVar105._0_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar93._0_4_;
  bVar84 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar93._4_4_;
  bVar84 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar93._8_4_;
  bVar84 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar84 * 0x219392ef | (uint)!bVar84 * auVar93._12_4_;
  auVar105._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar105._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar105._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar105._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar104 = vrcp14ps_avx512vl(auVar102);
  auVar114._8_4_ = 0x3f800000;
  auVar114._0_8_ = &DAT_3f8000003f800000;
  auVar114._12_4_ = 0x3f800000;
  auVar114._16_4_ = 0x3f800000;
  auVar114._20_4_ = 0x3f800000;
  auVar114._24_4_ = 0x3f800000;
  auVar114._28_4_ = 0x3f800000;
  auVar23 = vfnmadd213ps_fma(auVar102,auVar104,auVar114);
  auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar99);
  auVar94 = vfnmadd213ps_fma(auVar99,auVar104,auVar114);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar105);
  auVar93 = vfnmadd213ps_fma(auVar105,auVar104,auVar114);
  auVar93 = vfmadd132ps_fma(ZEXT1632(auVar93),auVar104,auVar104);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 7 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar104 = vsubps_avx512vl(auVar105,auVar103);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 9 + 6));
  auVar106._4_4_ = auVar23._4_4_ * auVar104._4_4_;
  auVar106._0_4_ = auVar23._0_4_ * auVar104._0_4_;
  auVar106._8_4_ = auVar23._8_4_ * auVar104._8_4_;
  auVar106._12_4_ = auVar23._12_4_ * auVar104._12_4_;
  auVar106._16_4_ = auVar104._16_4_ * 0.0;
  auVar106._20_4_ = auVar104._20_4_ * 0.0;
  auVar106._24_4_ = auVar104._24_4_ * 0.0;
  auVar106._28_4_ = auVar104._28_4_;
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx512vl(auVar105,auVar103);
  auVar112._0_4_ = auVar23._0_4_ * auVar105._0_4_;
  auVar112._4_4_ = auVar23._4_4_ * auVar105._4_4_;
  auVar112._8_4_ = auVar23._8_4_ * auVar105._8_4_;
  auVar112._12_4_ = auVar23._12_4_ * auVar105._12_4_;
  auVar112._16_4_ = auVar105._16_4_ * 0.0;
  auVar112._20_4_ = auVar105._20_4_ * 0.0;
  auVar112._24_4_ = auVar105._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar12 * 0x10 + uVar89 * -2 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar197));
  auVar107._4_4_ = auVar94._4_4_ * auVar105._4_4_;
  auVar107._0_4_ = auVar94._0_4_ * auVar105._0_4_;
  auVar107._8_4_ = auVar94._8_4_ * auVar105._8_4_;
  auVar107._12_4_ = auVar94._12_4_ * auVar105._12_4_;
  auVar107._16_4_ = auVar105._16_4_ * 0.0;
  auVar107._20_4_ = auVar105._20_4_ * 0.0;
  auVar107._24_4_ = auVar105._24_4_ * 0.0;
  auVar107._28_4_ = auVar105._28_4_;
  auVar105 = vcvtdq2ps_avx(auVar103);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar197));
  auVar110._0_4_ = auVar94._0_4_ * auVar105._0_4_;
  auVar110._4_4_ = auVar94._4_4_ * auVar105._4_4_;
  auVar110._8_4_ = auVar94._8_4_ * auVar105._8_4_;
  auVar110._12_4_ = auVar94._12_4_ * auVar105._12_4_;
  auVar110._16_4_ = auVar105._16_4_ * 0.0;
  auVar110._20_4_ = auVar105._20_4_ * 0.0;
  auVar110._24_4_ = auVar105._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + uVar89 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar8));
  auVar108._4_4_ = auVar105._4_4_ * auVar93._4_4_;
  auVar108._0_4_ = auVar105._0_4_ * auVar93._0_4_;
  auVar108._8_4_ = auVar105._8_4_ * auVar93._8_4_;
  auVar108._12_4_ = auVar105._12_4_ * auVar93._12_4_;
  auVar108._16_4_ = auVar105._16_4_ * 0.0;
  auVar108._20_4_ = auVar105._20_4_ * 0.0;
  auVar108._24_4_ = auVar105._24_4_ * 0.0;
  auVar108._28_4_ = auVar105._28_4_;
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x17 + 6));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar105 = vsubps_avx(auVar105,ZEXT1632(auVar8));
  auVar100._0_4_ = auVar93._0_4_ * auVar105._0_4_;
  auVar100._4_4_ = auVar93._4_4_ * auVar105._4_4_;
  auVar100._8_4_ = auVar93._8_4_ * auVar105._8_4_;
  auVar100._12_4_ = auVar93._12_4_ * auVar105._12_4_;
  auVar100._16_4_ = auVar105._16_4_ * 0.0;
  auVar100._20_4_ = auVar105._20_4_ * 0.0;
  auVar100._24_4_ = auVar105._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar105 = vpminsd_avx2(auVar106,auVar112);
  auVar103 = vpminsd_avx2(auVar107,auVar110);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103 = vpminsd_avx2(auVar108,auVar100);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar104._4_4_ = uVar147;
  auVar104._0_4_ = uVar147;
  auVar104._8_4_ = uVar147;
  auVar104._12_4_ = uVar147;
  auVar104._16_4_ = uVar147;
  auVar104._20_4_ = uVar147;
  auVar104._24_4_ = uVar147;
  auVar104._28_4_ = uVar147;
  auVar103 = vmaxps_avx512vl(auVar103,auVar104);
  auVar105 = vmaxps_avx(auVar105,auVar103);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  auVar103._16_4_ = 0x3f7ffffa;
  auVar103._20_4_ = 0x3f7ffffa;
  auVar103._24_4_ = 0x3f7ffffa;
  auVar103._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar105,auVar103);
  auVar178 = ZEXT3264(local_80);
  auVar105 = vpmaxsd_avx2(auVar106,auVar112);
  auVar157 = ZEXT3264(auVar105);
  auVar103 = vpmaxsd_avx2(auVar107,auVar110);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar103 = vpmaxsd_avx2(auVar108,auVar100);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar118._4_4_ = uVar147;
  auVar118._0_4_ = uVar147;
  auVar118._8_4_ = uVar147;
  auVar118._12_4_ = uVar147;
  auVar118._16_4_ = uVar147;
  auVar118._20_4_ = uVar147;
  auVar118._24_4_ = uVar147;
  auVar118._28_4_ = uVar147;
  auVar103 = vminps_avx512vl(auVar103,auVar118);
  auVar105 = vminps_avx(auVar105,auVar103);
  auVar117._8_4_ = 0x3f800003;
  auVar117._0_8_ = 0x3f8000033f800003;
  auVar117._12_4_ = 0x3f800003;
  auVar117._16_4_ = 0x3f800003;
  auVar117._20_4_ = 0x3f800003;
  auVar117._24_4_ = 0x3f800003;
  auVar117._28_4_ = 0x3f800003;
  auVar105 = vmulps_avx512vl(auVar105,auVar117);
  auVar103 = vpbroadcastd_avx512vl();
  uVar24 = vpcmpgtd_avx512vl(auVar103,_DAT_0205a920);
  uVar148 = vcmpps_avx512vl(local_80,auVar105,2);
  local_6f9 = (byte)((byte)uVar148 & (byte)uVar24) != 0;
  if (local_6f9) {
    uVar87 = (ulong)(byte)((byte)uVar148 & (byte)uVar24);
    local_548 = pre->ray_space + k;
    local_450 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar103 = auVar178._0_32_;
      auVar105 = auVar157._0_32_;
      local_4e0 = in_ZMM21._0_32_;
      local_4c0 = in_ZMM20._0_32_;
      lVar25 = 0;
      for (uVar89 = uVar87; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      local_668 = (ulong)*(uint *)(prim + 2);
      pGVar14 = (context->scene->geometries).items[local_668].ptr;
      uVar89 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                               pGVar14[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(prim + lVar25 * 4 + 6));
      p_Var15 = pGVar14[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar14[1].time_range.upper;
      auVar23 = *(undefined1 (*) [16])(lVar25 + (long)p_Var15 * uVar89);
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar89 + 1) * (long)p_Var15);
      local_5b0 = *(undefined8 *)*pauVar3;
      uStack_5a8 = *(undefined8 *)(*pauVar3 + 8);
      auVar94 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar25 + (uVar89 + 2) * (long)p_Var15);
      local_5c0 = *(undefined8 *)*pauVar4;
      uStack_5b8 = *(undefined8 *)(*pauVar4 + 8);
      auVar93 = *pauVar4;
      uVar87 = uVar87 - 1 & uVar87;
      pauVar5 = (undefined1 (*) [16])(lVar25 + (uVar89 + 3) * (long)p_Var15);
      local_560 = *(undefined8 *)*pauVar5;
      uStack_558 = *(undefined8 *)(*pauVar5 + 8);
      auVar197 = *pauVar5;
      if (uVar87 != 0) {
        uVar85 = uVar87 - 1 & uVar87;
        for (uVar89 = uVar87; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        }
        if (uVar85 != 0) {
          for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar92 = vsubps_avx(auVar23,auVar8);
      uVar147 = auVar92._0_4_;
      auVar156._4_4_ = uVar147;
      auVar156._0_4_ = uVar147;
      auVar156._8_4_ = uVar147;
      auVar156._12_4_ = uVar147;
      auVar9 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      aVar6 = (local_548->vx).field_0;
      aVar7 = (local_548->vy).field_0;
      fVar167 = (local_548->vz).field_0.m128[0];
      fVar146 = *(float *)((long)&(local_548->vz).field_0 + 4);
      fVar172 = *(float *)((long)&(local_548->vz).field_0 + 8);
      fVar173 = *(float *)((long)&(local_548->vz).field_0 + 0xc);
      auVar96._0_4_ = fVar167 * auVar92._0_4_;
      auVar96._4_4_ = fVar146 * auVar92._4_4_;
      auVar96._8_4_ = fVar172 * auVar92._8_4_;
      auVar96._12_4_ = fVar173 * auVar92._12_4_;
      auVar9 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar7,auVar9);
      auVar11 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar6,auVar156);
      auVar9 = vshufps_avx(auVar23,auVar23,0xff);
      auVar10 = vsubps_avx(auVar94,auVar8);
      uVar147 = auVar10._0_4_;
      auVar95._4_4_ = uVar147;
      auVar95._0_4_ = uVar147;
      auVar95._8_4_ = uVar147;
      auVar95._12_4_ = uVar147;
      auVar92 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar183._0_4_ = fVar167 * auVar10._0_4_;
      auVar183._4_4_ = fVar146 * auVar10._4_4_;
      auVar183._8_4_ = fVar172 * auVar10._8_4_;
      auVar183._12_4_ = fVar173 * auVar10._12_4_;
      auVar92 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar7,auVar92);
      auVar156 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar6,auVar95);
      auVar94 = vshufps_avx(auVar94,auVar94,0xff);
      auVar10 = vsubps_avx(auVar93,auVar8);
      uVar147 = auVar10._0_4_;
      auVar179._4_4_ = uVar147;
      auVar179._0_4_ = uVar147;
      auVar179._8_4_ = uVar147;
      auVar179._12_4_ = uVar147;
      auVar92 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar185._0_4_ = fVar167 * auVar10._0_4_;
      auVar185._4_4_ = fVar146 * auVar10._4_4_;
      auVar185._8_4_ = fVar172 * auVar10._8_4_;
      auVar185._12_4_ = fVar173 * auVar10._12_4_;
      auVar92 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar7,auVar92);
      auVar10 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar6,auVar179);
      auVar93 = vshufps_avx(auVar93,auVar93,0xff);
      auVar92 = vsubps_avx512vl(auVar197,auVar8);
      uVar147 = auVar92._0_4_;
      auVar160._4_4_ = uVar147;
      auVar160._0_4_ = uVar147;
      auVar160._8_4_ = uVar147;
      auVar160._12_4_ = uVar147;
      auVar8 = vshufps_avx(auVar92,auVar92,0x55);
      auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
      auVar186._0_4_ = fVar167 * auVar92._0_4_;
      auVar186._4_4_ = fVar146 * auVar92._4_4_;
      auVar186._8_4_ = fVar172 * auVar92._8_4_;
      auVar186._12_4_ = fVar173 * auVar92._12_4_;
      auVar8 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar7,auVar8);
      auVar8 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar160);
      lVar25 = (long)iVar13 * 0x44;
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      auVar92 = vshufps_avx512vl(auVar197,auVar197,0xff);
      local_480 = vbroadcastss_avx512vl(auVar11);
      auVar163._8_4_ = 1;
      auVar163._0_8_ = 0x100000001;
      auVar163._12_4_ = 1;
      auVar163._16_4_ = 1;
      auVar163._20_4_ = 1;
      auVar163._24_4_ = 1;
      auVar163._28_4_ = 1;
      local_4a0 = vpermps_avx512vl(auVar163,ZEXT1632(auVar11));
      uVar148 = auVar9._0_8_;
      local_a0._8_8_ = uVar148;
      local_a0._0_8_ = uVar148;
      local_a0._16_8_ = uVar148;
      local_a0._24_8_ = uVar148;
      auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      uVar147 = auVar156._0_4_;
      local_5a0._4_4_ = uVar147;
      local_5a0._0_4_ = uVar147;
      local_5a0._8_4_ = uVar147;
      local_5a0._12_4_ = uVar147;
      local_5a0._16_4_ = uVar147;
      local_5a0._20_4_ = uVar147;
      local_5a0._24_4_ = uVar147;
      local_5a0._28_4_ = uVar147;
      local_1c0 = vpermps_avx512vl(auVar163,ZEXT1632(auVar156));
      local_c0 = vbroadcastsd_avx512vl(auVar94);
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      local_e0 = vbroadcastss_avx512vl(auVar10);
      local_100 = vpermps_avx512vl(auVar163,ZEXT1632(auVar10));
      local_120 = vbroadcastsd_avx512vl(auVar93);
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0xd8c);
      local_500 = vbroadcastss_avx512vl(auVar8);
      auVar199 = ZEXT3264(local_500);
      local_520 = vpermps_avx512vl(auVar163,ZEXT1632(auVar8));
      uVar148 = auVar92._0_8_;
      register0x000012c8 = uVar148;
      local_140 = uVar148;
      register0x000012d0 = uVar148;
      register0x000012d8 = uVar148;
      auVar106 = vmulps_avx512vl(local_500,auVar116);
      auVar107 = vmulps_avx512vl(local_520,auVar116);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar117,local_e0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar117,local_100);
      auVar94 = vfmadd231ps_fma(auVar106,auVar118,local_5a0);
      auVar108 = vfmadd231ps_avx512vl(auVar107,auVar118,local_1c0);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar104,local_480);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar109 = vfmadd231ps_avx512vl(auVar108,auVar104,local_4a0);
      auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0xd8c);
      auVar101 = vmulps_avx512vl(local_500,auVar115);
      auVar99 = vmulps_avx512vl(local_520,auVar115);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_e0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_100);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_5a0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,local_1c0);
      auVar100 = vfmadd231ps_avx512vl(auVar101,auVar106,local_480);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_4a0);
      auVar110 = vsubps_avx512vl(auVar100,auVar102);
      auVar111 = vsubps_avx512vl(auVar99,auVar109);
      auVar101 = vmulps_avx512vl(auVar109,auVar110);
      auVar112 = vmulps_avx512vl(auVar102,auVar111);
      auVar101 = vsubps_avx512vl(auVar101,auVar112);
      auVar112 = vmulps_avx512vl(_local_140,auVar116);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar117,local_120);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,local_c0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar104,local_a0);
      auVar113 = vmulps_avx512vl(_local_140,auVar115);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,local_120);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar107,local_c0);
      auVar9 = vfmadd231ps_fma(auVar113,auVar106,local_a0);
      auVar113 = vmulps_avx512vl(auVar111,auVar111);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,auVar110);
      auVar114 = vmaxps_avx512vl(auVar112,ZEXT1632(auVar9));
      auVar114 = vmulps_avx512vl(auVar114,auVar114);
      auVar113 = vmulps_avx512vl(auVar114,auVar113);
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      uVar148 = vcmpps_avx512vl(auVar101,auVar113,2);
      auVar94 = vblendps_avx(auVar11,auVar23,8);
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar93 = vandps_avx512vl(auVar94,auVar92);
      auVar94 = vblendps_avx(auVar156,*pauVar3,8);
      auVar94 = vandps_avx512vl(auVar94,auVar92);
      auVar93 = vmaxps_avx(auVar93,auVar94);
      auVar94 = vblendps_avx(auVar10,*pauVar4,8);
      auVar95 = vandps_avx512vl(auVar94,auVar92);
      auVar94 = vblendps_avx(auVar8,auVar197,8);
      auVar94 = vandps_avx512vl(auVar94,auVar92);
      auVar94 = vmaxps_avx(auVar95,auVar94);
      auVar94 = vmaxps_avx(auVar93,auVar94);
      auVar93 = vmovshdup_avx(auVar94);
      auVar93 = vmaxss_avx(auVar93,auVar94);
      auVar94 = vshufpd_avx(auVar94,auVar94,1);
      auVar94 = vmaxss_avx(auVar94,auVar93);
      local_5d0._0_4_ = (undefined4)iVar13;
      local_5d0._4_12_ = auVar11._4_12_;
      auVar187._4_4_ = local_5d0._0_4_;
      auVar187._0_4_ = local_5d0._0_4_;
      auVar187._8_4_ = local_5d0._0_4_;
      auVar187._12_4_ = local_5d0._0_4_;
      auVar187._16_4_ = local_5d0._0_4_;
      auVar187._20_4_ = local_5d0._0_4_;
      auVar187._24_4_ = local_5d0._0_4_;
      auVar187._28_4_ = local_5d0._0_4_;
      uVar24 = vcmpps_avx512vl(auVar187,_DAT_02020f40,0xe);
      local_2d0 = (byte)uVar148 & (byte)uVar24;
      local_440 = auVar94._0_4_ * 4.7683716e-07;
      auVar164._8_4_ = 2;
      auVar164._0_8_ = 0x200000002;
      auVar164._12_4_ = 2;
      auVar164._16_4_ = 2;
      auVar164._20_4_ = 2;
      auVar164._24_4_ = 2;
      auVar164._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar164,ZEXT1632(auVar11));
      local_180 = vpermps_avx512vl(auVar164,ZEXT1632(auVar156));
      local_1a0 = vpermps_avx512vl(auVar164,ZEXT1632(auVar10));
      auVar101 = vpermps_avx2(auVar164,ZEXT1632(auVar8));
      uVar86 = *(uint *)(ray + k * 4 + 0x30);
      auVar94 = auVar110._0_16_;
      local_630 = ZEXT416((uint)local_440);
      if (local_2d0 == 0) {
        bVar84 = false;
        auVar94 = vxorps_avx512vl(auVar94,auVar94);
        auVar198 = ZEXT1664(auVar94);
        auVar178 = ZEXT3264(auVar103);
        in_ZMM20 = ZEXT3264(local_4c0);
        auVar157 = ZEXT3264(auVar105);
        in_ZMM21 = ZEXT3264(local_4e0);
        auVar196 = ZEXT3264(local_480);
        auVar195 = ZEXT3264(local_4a0);
        auVar194 = ZEXT3264(local_5a0);
        auVar200 = ZEXT3264(local_520);
      }
      else {
        local_540._0_16_ = ZEXT416(uVar86);
        auVar115 = vmulps_avx512vl(auVar101,auVar115);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_1a0,auVar115);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar108);
        auVar107 = vfmadd213ps_avx512vl(auVar106,local_160,auVar107);
        auVar116 = vmulps_avx512vl(auVar101,auVar116);
        auVar117 = vfmadd213ps_avx512vl(auVar117,local_1a0,auVar116);
        auVar108 = vfmadd213ps_avx512vl(auVar118,local_180,auVar117);
        auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1f9c);
        auVar108 = vfmadd213ps_avx512vl(auVar104,local_160,auVar108);
        auVar104 = vmulps_avx512vl(local_500,auVar106);
        auVar115 = vmulps_avx512vl(local_520,auVar106);
        auVar35._4_4_ = auVar101._4_4_ * auVar106._4_4_;
        auVar35._0_4_ = auVar101._0_4_ * auVar106._0_4_;
        auVar35._8_4_ = auVar101._8_4_ * auVar106._8_4_;
        auVar35._12_4_ = auVar101._12_4_ * auVar106._12_4_;
        auVar35._16_4_ = auVar101._16_4_ * auVar106._16_4_;
        auVar35._20_4_ = auVar101._20_4_ * auVar106._20_4_;
        auVar35._24_4_ = auVar101._24_4_ * auVar106._24_4_;
        auVar35._28_4_ = auVar106._28_4_;
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar116,local_e0);
        auVar106 = vfmadd231ps_avx512vl(auVar115,auVar116,local_100);
        auVar116 = vfmadd231ps_avx512vl(auVar35,local_1a0,auVar116);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar117,local_5a0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar117,local_1c0);
        auVar115 = vfmadd231ps_avx512vl(auVar116,local_180,auVar117);
        auVar113 = vfmadd231ps_avx512vl(auVar104,auVar118,local_480);
        auVar195 = ZEXT3264(local_4a0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar118,local_4a0);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1f9c);
        auVar115 = vfmadd231ps_avx512vl(auVar115,local_160,auVar118);
        auVar118 = vmulps_avx512vl(local_500,auVar116);
        auVar114 = vmulps_avx512vl(local_520,auVar116);
        auVar36._4_4_ = auVar101._4_4_ * auVar116._4_4_;
        auVar36._0_4_ = auVar101._0_4_ * auVar116._0_4_;
        auVar36._8_4_ = auVar101._8_4_ * auVar116._8_4_;
        auVar36._12_4_ = auVar101._12_4_ * auVar116._12_4_;
        auVar36._16_4_ = auVar101._16_4_ * auVar116._16_4_;
        auVar36._20_4_ = auVar101._20_4_ * auVar116._20_4_;
        auVar36._24_4_ = auVar101._24_4_ * auVar116._24_4_;
        auVar36._28_4_ = auVar116._28_4_;
        auVar116 = vfmadd231ps_avx512vl(auVar118,auVar117,local_e0);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar117,local_100);
        auVar117 = vfmadd231ps_avx512vl(auVar36,local_1a0,auVar117);
        auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar118,local_5a0);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar118,local_1c0);
        auVar118 = vfmadd231ps_avx512vl(auVar117,local_180,auVar118);
        auVar117 = vfmadd231ps_avx512vl(auVar116,auVar104,local_480);
        auVar116 = vfmadd231ps_avx512vl(auVar114,auVar104,local_4a0);
        auVar114 = vfmadd231ps_avx512vl(auVar118,local_160,auVar104);
        auVar192._8_4_ = 0x7fffffff;
        auVar192._0_8_ = 0x7fffffff7fffffff;
        auVar192._12_4_ = 0x7fffffff;
        auVar192._16_4_ = 0x7fffffff;
        auVar192._20_4_ = 0x7fffffff;
        auVar192._24_4_ = 0x7fffffff;
        auVar192._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(auVar113,auVar192);
        auVar118 = vandps_avx(auVar106,auVar192);
        auVar118 = vmaxps_avx(auVar104,auVar118);
        auVar104 = vandps_avx(auVar115,auVar192);
        auVar104 = vmaxps_avx(auVar118,auVar104);
        auVar115 = vbroadcastss_avx512vl(local_630);
        uVar89 = vcmpps_avx512vl(auVar104,auVar115,1);
        bVar84 = (bool)((byte)uVar89 & 1);
        auVar119._0_4_ = (float)((uint)bVar84 * auVar110._0_4_ | (uint)!bVar84 * auVar113._0_4_);
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar84 * auVar110._4_4_ | (uint)!bVar84 * auVar113._4_4_);
        bVar84 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar84 * auVar110._8_4_ | (uint)!bVar84 * auVar113._8_4_);
        bVar84 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar84 * auVar110._12_4_ | (uint)!bVar84 * auVar113._12_4_);
        bVar84 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar84 * auVar110._16_4_ | (uint)!bVar84 * auVar113._16_4_);
        bVar84 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar84 * auVar110._20_4_ | (uint)!bVar84 * auVar113._20_4_);
        bVar84 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar84 * auVar110._24_4_ | (uint)!bVar84 * auVar113._24_4_);
        bVar84 = SUB81(uVar89 >> 7,0);
        auVar119._28_4_ = (uint)bVar84 * auVar110._28_4_ | (uint)!bVar84 * auVar113._28_4_;
        bVar84 = (bool)((byte)uVar89 & 1);
        auVar120._0_4_ = (float)((uint)bVar84 * auVar111._0_4_ | (uint)!bVar84 * auVar106._0_4_);
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar84 * auVar111._4_4_ | (uint)!bVar84 * auVar106._4_4_);
        bVar84 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar84 * auVar111._8_4_ | (uint)!bVar84 * auVar106._8_4_);
        bVar84 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar84 * auVar111._12_4_ | (uint)!bVar84 * auVar106._12_4_);
        bVar84 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar84 * auVar111._16_4_ | (uint)!bVar84 * auVar106._16_4_);
        bVar84 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar84 * auVar111._20_4_ | (uint)!bVar84 * auVar106._20_4_);
        bVar84 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar84 * auVar111._24_4_ | (uint)!bVar84 * auVar106._24_4_);
        bVar84 = SUB81(uVar89 >> 7,0);
        auVar120._28_4_ = (uint)bVar84 * auVar111._28_4_ | (uint)!bVar84 * auVar106._28_4_;
        auVar104 = vandps_avx(auVar192,auVar117);
        auVar118 = vandps_avx(auVar116,auVar192);
        auVar118 = vmaxps_avx(auVar104,auVar118);
        auVar104 = vandps_avx(auVar114,auVar192);
        auVar104 = vmaxps_avx(auVar118,auVar104);
        uVar89 = vcmpps_avx512vl(auVar104,auVar115,1);
        bVar84 = (bool)((byte)uVar89 & 1);
        auVar121._0_4_ = (float)((uint)bVar84 * auVar110._0_4_ | (uint)!bVar84 * auVar117._0_4_);
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar84 * auVar110._4_4_ | (uint)!bVar84 * auVar117._4_4_);
        bVar84 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar84 * auVar110._8_4_ | (uint)!bVar84 * auVar117._8_4_);
        bVar84 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar84 * auVar110._12_4_ | (uint)!bVar84 * auVar117._12_4_);
        bVar84 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar84 * auVar110._16_4_ | (uint)!bVar84 * auVar117._16_4_);
        bVar84 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar84 * auVar110._20_4_ | (uint)!bVar84 * auVar117._20_4_);
        bVar84 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar84 * auVar110._24_4_ | (uint)!bVar84 * auVar117._24_4_);
        bVar84 = SUB81(uVar89 >> 7,0);
        auVar121._28_4_ = (uint)bVar84 * auVar110._28_4_ | (uint)!bVar84 * auVar117._28_4_;
        bVar84 = (bool)((byte)uVar89 & 1);
        auVar122._0_4_ = (float)((uint)bVar84 * auVar111._0_4_ | (uint)!bVar84 * auVar116._0_4_);
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar84 * auVar111._4_4_ | (uint)!bVar84 * auVar116._4_4_);
        bVar84 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar84 * auVar111._8_4_ | (uint)!bVar84 * auVar116._8_4_);
        bVar84 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar84 * auVar111._12_4_ | (uint)!bVar84 * auVar116._12_4_);
        bVar84 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar84 * auVar111._16_4_ | (uint)!bVar84 * auVar116._16_4_);
        bVar84 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar84 * auVar111._20_4_ | (uint)!bVar84 * auVar116._20_4_);
        bVar84 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar84 * auVar111._24_4_ | (uint)!bVar84 * auVar116._24_4_);
        bVar84 = SUB81(uVar89 >> 7,0);
        auVar122._28_4_ = (uint)bVar84 * auVar111._28_4_ | (uint)!bVar84 * auVar116._28_4_;
        auVar96 = vxorps_avx512vl(auVar94,auVar94);
        auVar198 = ZEXT1664(auVar96);
        auVar104 = vfmadd213ps_avx512vl(auVar119,auVar119,ZEXT1632(auVar96));
        auVar94 = vfmadd231ps_fma(auVar104,auVar120,auVar120);
        auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar167 = auVar104._0_4_;
        fVar146 = auVar104._4_4_;
        fVar172 = auVar104._8_4_;
        fVar173 = auVar104._12_4_;
        fVar159 = auVar104._16_4_;
        fVar166 = auVar104._20_4_;
        fVar90 = auVar104._24_4_;
        auVar37._4_4_ = fVar146 * fVar146 * fVar146 * auVar94._4_4_ * -0.5;
        auVar37._0_4_ = fVar167 * fVar167 * fVar167 * auVar94._0_4_ * -0.5;
        auVar37._8_4_ = fVar172 * fVar172 * fVar172 * auVar94._8_4_ * -0.5;
        auVar37._12_4_ = fVar173 * fVar173 * fVar173 * auVar94._12_4_ * -0.5;
        auVar37._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
        auVar37._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar37._24_4_ = fVar90 * fVar90 * fVar90 * -0.0;
        auVar37._28_4_ = 0;
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar117 = vfmadd231ps_avx512vl(auVar37,auVar118,auVar104);
        auVar38._4_4_ = auVar120._4_4_ * auVar117._4_4_;
        auVar38._0_4_ = auVar120._0_4_ * auVar117._0_4_;
        auVar38._8_4_ = auVar120._8_4_ * auVar117._8_4_;
        auVar38._12_4_ = auVar120._12_4_ * auVar117._12_4_;
        auVar38._16_4_ = auVar120._16_4_ * auVar117._16_4_;
        auVar38._20_4_ = auVar120._20_4_ * auVar117._20_4_;
        auVar38._24_4_ = auVar120._24_4_ * auVar117._24_4_;
        auVar38._28_4_ = auVar104._28_4_;
        auVar39._4_4_ = auVar117._4_4_ * -auVar119._4_4_;
        auVar39._0_4_ = auVar117._0_4_ * -auVar119._0_4_;
        auVar39._8_4_ = auVar117._8_4_ * -auVar119._8_4_;
        auVar39._12_4_ = auVar117._12_4_ * -auVar119._12_4_;
        auVar39._16_4_ = auVar117._16_4_ * -auVar119._16_4_;
        auVar39._20_4_ = auVar117._20_4_ * -auVar119._20_4_;
        auVar39._24_4_ = auVar117._24_4_ * -auVar119._24_4_;
        auVar39._28_4_ = auVar119._28_4_ ^ 0x80000000;
        auVar104 = vmulps_avx512vl(auVar117,ZEXT1632(auVar96));
        auVar110 = ZEXT1632(auVar96);
        auVar116 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar110);
        auVar94 = vfmadd231ps_fma(auVar116,auVar122,auVar122);
        auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar167 = auVar116._0_4_;
        fVar146 = auVar116._4_4_;
        fVar172 = auVar116._8_4_;
        fVar173 = auVar116._12_4_;
        fVar159 = auVar116._16_4_;
        fVar166 = auVar116._20_4_;
        fVar90 = auVar116._24_4_;
        auVar40._4_4_ = fVar146 * fVar146 * fVar146 * auVar94._4_4_ * -0.5;
        auVar40._0_4_ = fVar167 * fVar167 * fVar167 * auVar94._0_4_ * -0.5;
        auVar40._8_4_ = fVar172 * fVar172 * fVar172 * auVar94._8_4_ * -0.5;
        auVar40._12_4_ = fVar173 * fVar173 * fVar173 * auVar94._12_4_ * -0.5;
        auVar40._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
        auVar40._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar40._24_4_ = fVar90 * fVar90 * fVar90 * -0.0;
        auVar40._28_4_ = 0;
        auVar118 = vfmadd231ps_avx512vl(auVar40,auVar118,auVar116);
        auVar41._4_4_ = auVar122._4_4_ * auVar118._4_4_;
        auVar41._0_4_ = auVar122._0_4_ * auVar118._0_4_;
        auVar41._8_4_ = auVar122._8_4_ * auVar118._8_4_;
        auVar41._12_4_ = auVar122._12_4_ * auVar118._12_4_;
        auVar41._16_4_ = auVar122._16_4_ * auVar118._16_4_;
        auVar41._20_4_ = auVar122._20_4_ * auVar118._20_4_;
        auVar41._24_4_ = auVar122._24_4_ * auVar118._24_4_;
        auVar41._28_4_ = auVar116._28_4_;
        auVar42._4_4_ = -auVar121._4_4_ * auVar118._4_4_;
        auVar42._0_4_ = -auVar121._0_4_ * auVar118._0_4_;
        auVar42._8_4_ = -auVar121._8_4_ * auVar118._8_4_;
        auVar42._12_4_ = -auVar121._12_4_ * auVar118._12_4_;
        auVar42._16_4_ = -auVar121._16_4_ * auVar118._16_4_;
        auVar42._20_4_ = -auVar121._20_4_ * auVar118._20_4_;
        auVar42._24_4_ = -auVar121._24_4_ * auVar118._24_4_;
        auVar42._28_4_ = auVar117._28_4_;
        auVar118 = vmulps_avx512vl(auVar118,auVar110);
        auVar94 = vfmadd213ps_fma(auVar38,auVar112,auVar102);
        auVar93 = vfmadd213ps_fma(auVar39,auVar112,auVar109);
        auVar117 = vfmadd213ps_avx512vl(auVar104,auVar112,auVar108);
        auVar116 = vfmadd213ps_avx512vl(auVar41,ZEXT1632(auVar9),auVar100);
        auVar11 = vfnmadd213ps_fma(auVar38,auVar112,auVar102);
        auVar115 = ZEXT1632(auVar9);
        auVar197 = vfmadd213ps_fma(auVar42,auVar115,auVar99);
        auVar156 = vfnmadd213ps_fma(auVar39,auVar112,auVar109);
        auVar8 = vfmadd213ps_fma(auVar118,auVar115,auVar107);
        auVar106 = vfnmadd231ps_avx512vl(auVar108,auVar112,auVar104);
        auVar95 = vfnmadd213ps_fma(auVar41,auVar115,auVar100);
        auVar160 = vfnmadd213ps_fma(auVar42,auVar115,auVar99);
        auVar179 = vfnmadd231ps_fma(auVar107,ZEXT1632(auVar9),auVar118);
        auVar118 = vsubps_avx512vl(auVar116,ZEXT1632(auVar11));
        auVar104 = vsubps_avx(ZEXT1632(auVar197),ZEXT1632(auVar156));
        auVar107 = vsubps_avx512vl(ZEXT1632(auVar8),auVar106);
        auVar108 = vmulps_avx512vl(auVar104,auVar106);
        auVar92 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar156),auVar107);
        auVar43._4_4_ = auVar11._4_4_ * auVar107._4_4_;
        auVar43._0_4_ = auVar11._0_4_ * auVar107._0_4_;
        auVar43._8_4_ = auVar11._8_4_ * auVar107._8_4_;
        auVar43._12_4_ = auVar11._12_4_ * auVar107._12_4_;
        auVar43._16_4_ = auVar107._16_4_ * 0.0;
        auVar43._20_4_ = auVar107._20_4_ * 0.0;
        auVar43._24_4_ = auVar107._24_4_ * 0.0;
        auVar43._28_4_ = auVar107._28_4_;
        auVar107 = vfmsub231ps_avx512vl(auVar43,auVar106,auVar118);
        auVar44._4_4_ = auVar156._4_4_ * auVar118._4_4_;
        auVar44._0_4_ = auVar156._0_4_ * auVar118._0_4_;
        auVar44._8_4_ = auVar156._8_4_ * auVar118._8_4_;
        auVar44._12_4_ = auVar156._12_4_ * auVar118._12_4_;
        auVar44._16_4_ = auVar118._16_4_ * 0.0;
        auVar44._20_4_ = auVar118._20_4_ * 0.0;
        auVar44._24_4_ = auVar118._24_4_ * 0.0;
        auVar44._28_4_ = auVar118._28_4_;
        auVar10 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar11),auVar104);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar110,auVar107);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,ZEXT1632(auVar92));
        auVar100 = ZEXT1632(auVar96);
        uVar89 = vcmpps_avx512vl(auVar104,auVar100,2);
        bVar82 = (byte)uVar89;
        fVar90 = (float)((uint)(bVar82 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar95._0_4_);
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar158 = (float)((uint)bVar84 * auVar94._4_4_ | (uint)!bVar84 * auVar95._4_4_);
        bVar84 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar139 = (float)((uint)bVar84 * auVar94._8_4_ | (uint)!bVar84 * auVar95._8_4_);
        bVar84 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar142 = (float)((uint)bVar84 * auVar94._12_4_ | (uint)!bVar84 * auVar95._12_4_);
        auVar108 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar139,CONCAT44(fVar158,fVar90))));
        fVar91 = (float)((uint)(bVar82 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar160._0_4_);
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar138 = (float)((uint)bVar84 * auVar93._4_4_ | (uint)!bVar84 * auVar160._4_4_);
        bVar84 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar140 = (float)((uint)bVar84 * auVar93._8_4_ | (uint)!bVar84 * auVar160._8_4_);
        bVar84 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar143 = (float)((uint)bVar84 * auVar93._12_4_ | (uint)!bVar84 * auVar160._12_4_);
        auVar115 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar140,CONCAT44(fVar138,fVar91))));
        auVar123._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar117._0_4_ |
                    (uint)!(bool)(bVar82 & 1) * auVar179._0_4_);
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar84 * auVar117._4_4_ | (uint)!bVar84 * auVar179._4_4_);
        bVar84 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar84 * auVar117._8_4_ | (uint)!bVar84 * auVar179._8_4_);
        bVar84 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar84 * auVar117._12_4_ | (uint)!bVar84 * auVar179._12_4_);
        fVar167 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar117._16_4_);
        auVar123._16_4_ = fVar167;
        fVar146 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar117._20_4_);
        auVar123._20_4_ = fVar146;
        fVar172 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar117._24_4_);
        auVar123._24_4_ = fVar172;
        iVar1 = (uint)(byte)(uVar89 >> 7) * auVar117._28_4_;
        auVar123._28_4_ = iVar1;
        auVar118 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar116);
        auVar124._0_4_ =
             (uint)(bVar82 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar92._0_4_;
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar84 * auVar118._4_4_ | (uint)!bVar84 * auVar92._4_4_;
        bVar84 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar84 * auVar118._8_4_ | (uint)!bVar84 * auVar92._8_4_;
        bVar84 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar84 * auVar118._12_4_ | (uint)!bVar84 * auVar92._12_4_;
        auVar124._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar118._16_4_;
        auVar124._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar118._20_4_;
        auVar124._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar118._24_4_;
        auVar124._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar118._28_4_;
        auVar118 = vblendmps_avx512vl(ZEXT1632(auVar156),ZEXT1632(auVar197));
        auVar125._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar93._0_4_
                    );
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar84 * auVar118._4_4_ | (uint)!bVar84 * auVar93._4_4_);
        bVar84 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar84 * auVar118._8_4_ | (uint)!bVar84 * auVar93._8_4_);
        bVar84 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar84 * auVar118._12_4_ | (uint)!bVar84 * auVar93._12_4_);
        fVar173 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar118._16_4_);
        auVar125._16_4_ = fVar173;
        fVar159 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar118._20_4_);
        auVar125._20_4_ = fVar159;
        fVar166 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar118._24_4_);
        auVar125._24_4_ = fVar166;
        auVar125._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar118._28_4_;
        auVar118 = vblendmps_avx512vl(auVar106,ZEXT1632(auVar8));
        auVar126._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar118._0_4_ |
                    (uint)!(bool)(bVar82 & 1) * auVar117._0_4_);
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar84 * auVar118._4_4_ | (uint)!bVar84 * auVar117._4_4_);
        bVar84 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar84 * auVar118._8_4_ | (uint)!bVar84 * auVar117._8_4_);
        bVar84 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar84 * auVar118._12_4_ | (uint)!bVar84 * auVar117._12_4_);
        bVar84 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar126._16_4_ = (float)((uint)bVar84 * auVar118._16_4_ | (uint)!bVar84 * auVar117._16_4_);
        bVar84 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar126._20_4_ = (float)((uint)bVar84 * auVar118._20_4_ | (uint)!bVar84 * auVar117._20_4_);
        bVar84 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar126._24_4_ = (float)((uint)bVar84 * auVar118._24_4_ | (uint)!bVar84 * auVar117._24_4_);
        bVar84 = SUB81(uVar89 >> 7,0);
        auVar126._28_4_ = (uint)bVar84 * auVar118._28_4_ | (uint)!bVar84 * auVar117._28_4_;
        auVar127._0_4_ =
             (uint)(bVar82 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar116._0_4_;
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar84 * (int)auVar11._4_4_ | (uint)!bVar84 * auVar116._4_4_;
        bVar84 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar84 * (int)auVar11._8_4_ | (uint)!bVar84 * auVar116._8_4_;
        bVar84 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar84 * (int)auVar11._12_4_ | (uint)!bVar84 * auVar116._12_4_;
        auVar127._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar116._16_4_;
        auVar127._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar116._20_4_;
        auVar127._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar116._24_4_;
        auVar127._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar116._28_4_;
        bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar128._0_4_ =
             (uint)(bVar82 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar8._0_4_;
        bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar16 * auVar106._4_4_ | (uint)!bVar16 * auVar8._4_4_;
        bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar16 * auVar106._8_4_ | (uint)!bVar16 * auVar8._8_4_;
        bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar16 * auVar106._12_4_ | (uint)!bVar16 * auVar8._12_4_;
        auVar128._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar106._16_4_;
        auVar128._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar106._20_4_;
        auVar128._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar106._24_4_;
        iVar2 = (uint)(byte)(uVar89 >> 7) * auVar106._28_4_;
        auVar128._28_4_ = iVar2;
        auVar102 = vsubps_avx512vl(auVar127,auVar108);
        auVar118 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar156._12_4_ |
                                                 (uint)!bVar18 * auVar197._12_4_,
                                                 CONCAT48((uint)bVar17 * (int)auVar156._8_4_ |
                                                          (uint)!bVar17 * auVar197._8_4_,
                                                          CONCAT44((uint)bVar84 *
                                                                   (int)auVar156._4_4_ |
                                                                   (uint)!bVar84 * auVar197._4_4_,
                                                                   (uint)(bVar82 & 1) *
                                                                   (int)auVar156._0_4_ |
                                                                   (uint)!(bool)(bVar82 & 1) *
                                                                   auVar197._0_4_)))),auVar115);
        auVar117 = vsubps_avx(auVar128,auVar123);
        auVar116 = vsubps_avx(auVar108,auVar124);
        auVar106 = vsubps_avx(auVar115,auVar125);
        auVar107 = vsubps_avx(auVar123,auVar126);
        auVar45._4_4_ = auVar117._4_4_ * fVar158;
        auVar45._0_4_ = auVar117._0_4_ * fVar90;
        auVar45._8_4_ = auVar117._8_4_ * fVar139;
        auVar45._12_4_ = auVar117._12_4_ * fVar142;
        auVar45._16_4_ = auVar117._16_4_ * 0.0;
        auVar45._20_4_ = auVar117._20_4_ * 0.0;
        auVar45._24_4_ = auVar117._24_4_ * 0.0;
        auVar45._28_4_ = iVar2;
        auVar94 = vfmsub231ps_fma(auVar45,auVar123,auVar102);
        auVar46._4_4_ = fVar138 * auVar102._4_4_;
        auVar46._0_4_ = fVar91 * auVar102._0_4_;
        auVar46._8_4_ = fVar140 * auVar102._8_4_;
        auVar46._12_4_ = fVar143 * auVar102._12_4_;
        auVar46._16_4_ = auVar102._16_4_ * 0.0;
        auVar46._20_4_ = auVar102._20_4_ * 0.0;
        auVar46._24_4_ = auVar102._24_4_ * 0.0;
        auVar46._28_4_ = auVar104._28_4_;
        auVar93 = vfmsub231ps_fma(auVar46,auVar108,auVar118);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar100,ZEXT1632(auVar94));
        auVar168._0_4_ = auVar118._0_4_ * auVar123._0_4_;
        auVar168._4_4_ = auVar118._4_4_ * auVar123._4_4_;
        auVar168._8_4_ = auVar118._8_4_ * auVar123._8_4_;
        auVar168._12_4_ = auVar118._12_4_ * auVar123._12_4_;
        auVar168._16_4_ = auVar118._16_4_ * fVar167;
        auVar168._20_4_ = auVar118._20_4_ * fVar146;
        auVar168._24_4_ = auVar118._24_4_ * fVar172;
        auVar168._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar168,auVar115,auVar117);
        auVar109 = vfmadd231ps_avx512vl(auVar104,auVar100,ZEXT1632(auVar94));
        auVar104 = vmulps_avx512vl(auVar107,auVar124);
        auVar104 = vfmsub231ps_avx512vl(auVar104,auVar116,auVar126);
        auVar47._4_4_ = auVar106._4_4_ * auVar126._4_4_;
        auVar47._0_4_ = auVar106._0_4_ * auVar126._0_4_;
        auVar47._8_4_ = auVar106._8_4_ * auVar126._8_4_;
        auVar47._12_4_ = auVar106._12_4_ * auVar126._12_4_;
        auVar47._16_4_ = auVar106._16_4_ * auVar126._16_4_;
        auVar47._20_4_ = auVar106._20_4_ * auVar126._20_4_;
        auVar47._24_4_ = auVar106._24_4_ * auVar126._24_4_;
        auVar47._28_4_ = auVar126._28_4_;
        auVar94 = vfmsub231ps_fma(auVar47,auVar125,auVar107);
        auVar169._0_4_ = auVar125._0_4_ * auVar116._0_4_;
        auVar169._4_4_ = auVar125._4_4_ * auVar116._4_4_;
        auVar169._8_4_ = auVar125._8_4_ * auVar116._8_4_;
        auVar169._12_4_ = auVar125._12_4_ * auVar116._12_4_;
        auVar169._16_4_ = fVar173 * auVar116._16_4_;
        auVar169._20_4_ = fVar159 * auVar116._20_4_;
        auVar169._24_4_ = fVar166 * auVar116._24_4_;
        auVar169._28_4_ = 0;
        auVar93 = vfmsub231ps_fma(auVar169,auVar106,auVar124);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar100,auVar104);
        auVar99 = vfmadd231ps_avx512vl(auVar104,auVar100,ZEXT1632(auVar94));
        auVar104 = vmaxps_avx(auVar109,auVar99);
        uVar148 = vcmpps_avx512vl(auVar104,auVar100,2);
        local_2d0 = local_2d0 & (byte)uVar148;
        in_ZMM20 = ZEXT3264(local_4c0);
        in_ZMM21 = ZEXT3264(local_4e0);
        auVar196 = ZEXT3264(local_480);
        auVar194 = ZEXT3264(local_5a0);
        auVar190 = ZEXT1664(local_630);
        if (local_2d0 == 0) {
          local_2d0 = 0;
          auVar178 = ZEXT3264(auVar103);
          auVar157 = ZEXT3264(auVar105);
        }
        else {
          auVar48._4_4_ = auVar107._4_4_ * auVar118._4_4_;
          auVar48._0_4_ = auVar107._0_4_ * auVar118._0_4_;
          auVar48._8_4_ = auVar107._8_4_ * auVar118._8_4_;
          auVar48._12_4_ = auVar107._12_4_ * auVar118._12_4_;
          auVar48._16_4_ = auVar107._16_4_ * auVar118._16_4_;
          auVar48._20_4_ = auVar107._20_4_ * auVar118._20_4_;
          auVar48._24_4_ = auVar107._24_4_ * auVar118._24_4_;
          auVar48._28_4_ = auVar104._28_4_;
          auVar197 = vfmsub231ps_fma(auVar48,auVar106,auVar117);
          auVar49._4_4_ = auVar117._4_4_ * auVar116._4_4_;
          auVar49._0_4_ = auVar117._0_4_ * auVar116._0_4_;
          auVar49._8_4_ = auVar117._8_4_ * auVar116._8_4_;
          auVar49._12_4_ = auVar117._12_4_ * auVar116._12_4_;
          auVar49._16_4_ = auVar117._16_4_ * auVar116._16_4_;
          auVar49._20_4_ = auVar117._20_4_ * auVar116._20_4_;
          auVar49._24_4_ = auVar117._24_4_ * auVar116._24_4_;
          auVar49._28_4_ = auVar117._28_4_;
          auVar93 = vfmsub231ps_fma(auVar49,auVar102,auVar107);
          auVar50._4_4_ = auVar106._4_4_ * auVar102._4_4_;
          auVar50._0_4_ = auVar106._0_4_ * auVar102._0_4_;
          auVar50._8_4_ = auVar106._8_4_ * auVar102._8_4_;
          auVar50._12_4_ = auVar106._12_4_ * auVar102._12_4_;
          auVar50._16_4_ = auVar106._16_4_ * auVar102._16_4_;
          auVar50._20_4_ = auVar106._20_4_ * auVar102._20_4_;
          auVar50._24_4_ = auVar106._24_4_ * auVar102._24_4_;
          auVar50._28_4_ = auVar106._28_4_;
          auVar8 = vfmsub231ps_fma(auVar50,auVar116,auVar118);
          auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar93),ZEXT1632(auVar8));
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar197),auVar100);
          auVar118 = vrcp14ps_avx512vl(auVar104);
          auVar26._8_4_ = 0x3f800000;
          auVar26._0_8_ = &DAT_3f8000003f800000;
          auVar26._12_4_ = 0x3f800000;
          auVar26._16_4_ = 0x3f800000;
          auVar26._20_4_ = 0x3f800000;
          auVar26._24_4_ = 0x3f800000;
          auVar26._28_4_ = 0x3f800000;
          auVar117 = vfnmadd213ps_avx512vl(auVar118,auVar104,auVar26);
          auVar94 = vfmadd132ps_fma(auVar117,auVar118,auVar118);
          auVar51._4_4_ = auVar8._4_4_ * auVar123._4_4_;
          auVar51._0_4_ = auVar8._0_4_ * auVar123._0_4_;
          auVar51._8_4_ = auVar8._8_4_ * auVar123._8_4_;
          auVar51._12_4_ = auVar8._12_4_ * auVar123._12_4_;
          auVar51._16_4_ = fVar167 * 0.0;
          auVar51._20_4_ = fVar146 * 0.0;
          auVar51._24_4_ = fVar172 * 0.0;
          auVar51._28_4_ = iVar1;
          auVar93 = vfmadd231ps_fma(auVar51,auVar115,ZEXT1632(auVar93));
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar108,ZEXT1632(auVar197));
          fVar167 = auVar94._0_4_;
          fVar146 = auVar94._4_4_;
          fVar172 = auVar94._8_4_;
          fVar173 = auVar94._12_4_;
          auVar118 = ZEXT1632(CONCAT412(auVar93._12_4_ * fVar173,
                                        CONCAT48(auVar93._8_4_ * fVar172,
                                                 CONCAT44(auVar93._4_4_ * fVar146,
                                                          auVar93._0_4_ * fVar167))));
          auVar157 = ZEXT3264(auVar118);
          auVar181._4_4_ = uVar86;
          auVar181._0_4_ = uVar86;
          auVar181._8_4_ = uVar86;
          auVar181._12_4_ = uVar86;
          auVar181._16_4_ = uVar86;
          auVar181._20_4_ = uVar86;
          auVar181._24_4_ = uVar86;
          auVar181._28_4_ = uVar86;
          uVar148 = vcmpps_avx512vl(auVar181,auVar118,2);
          uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar27._4_4_ = uVar147;
          auVar27._0_4_ = uVar147;
          auVar27._8_4_ = uVar147;
          auVar27._12_4_ = uVar147;
          auVar27._16_4_ = uVar147;
          auVar27._20_4_ = uVar147;
          auVar27._24_4_ = uVar147;
          auVar27._28_4_ = uVar147;
          uVar24 = vcmpps_avx512vl(auVar118,auVar27,2);
          local_2d0 = (byte)uVar148 & (byte)uVar24 & local_2d0;
          if (local_2d0 == 0) {
            local_2d0 = 0;
            auVar178 = ZEXT3264(auVar103);
            auVar157 = ZEXT3264(auVar105);
          }
          else {
            uVar148 = vcmpps_avx512vl(auVar104,auVar100,4);
            if ((local_2d0 & (byte)uVar148) == 0) {
              local_2d0 = 0;
              auVar178 = ZEXT3264(auVar103);
              auVar157 = ZEXT3264(auVar105);
            }
            else {
              local_2d0 = local_2d0 & (byte)uVar148;
              fVar159 = auVar109._0_4_ * fVar167;
              fVar166 = auVar109._4_4_ * fVar146;
              auVar52._4_4_ = fVar166;
              auVar52._0_4_ = fVar159;
              fVar90 = auVar109._8_4_ * fVar172;
              auVar52._8_4_ = fVar90;
              fVar91 = auVar109._12_4_ * fVar173;
              auVar52._12_4_ = fVar91;
              fVar158 = auVar109._16_4_ * 0.0;
              auVar52._16_4_ = fVar158;
              fVar138 = auVar109._20_4_ * 0.0;
              auVar52._20_4_ = fVar138;
              fVar139 = auVar109._24_4_ * 0.0;
              auVar52._24_4_ = fVar139;
              auVar52._28_4_ = auVar109._28_4_;
              fVar167 = auVar99._0_4_ * fVar167;
              fVar146 = auVar99._4_4_ * fVar146;
              auVar53._4_4_ = fVar146;
              auVar53._0_4_ = fVar167;
              fVar172 = auVar99._8_4_ * fVar172;
              auVar53._8_4_ = fVar172;
              fVar173 = auVar99._12_4_ * fVar173;
              auVar53._12_4_ = fVar173;
              fVar140 = auVar99._16_4_ * 0.0;
              auVar53._16_4_ = fVar140;
              fVar142 = auVar99._20_4_ * 0.0;
              auVar53._20_4_ = fVar142;
              fVar143 = auVar99._24_4_ * 0.0;
              auVar53._24_4_ = fVar143;
              auVar53._28_4_ = auVar99._28_4_;
              auVar176._8_4_ = 0x3f800000;
              auVar176._0_8_ = &DAT_3f8000003f800000;
              auVar176._12_4_ = 0x3f800000;
              auVar176._16_4_ = 0x3f800000;
              auVar176._20_4_ = 0x3f800000;
              auVar176._24_4_ = 0x3f800000;
              auVar176._28_4_ = 0x3f800000;
              auVar105 = vsubps_avx(auVar176,auVar52);
              bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar89 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar89 >> 6) & 1);
              bVar21 = SUB81(uVar89 >> 7,0);
              auVar178 = ZEXT3264(CONCAT428((uint)bVar21 * auVar109._28_4_ |
                                            (uint)!bVar21 * auVar105._28_4_,
                                            CONCAT424((uint)bVar20 * (int)fVar139 |
                                                      (uint)!bVar20 * auVar105._24_4_,
                                                      CONCAT420((uint)bVar19 * (int)fVar138 |
                                                                (uint)!bVar19 * auVar105._20_4_,
                                                                CONCAT416((uint)bVar18 *
                                                                          (int)fVar158 |
                                                                          (uint)!bVar18 *
                                                                          auVar105._16_4_,
                                                                          CONCAT412((uint)bVar17 *
                                                                                    (int)fVar91 |
                                                                                    (uint)!bVar17 *
                                                                                    auVar105._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar16 * (int)fVar90 |
                                                  (uint)!bVar16 * auVar105._8_4_,
                                                  CONCAT44((uint)bVar84 * (int)fVar166 |
                                                           (uint)!bVar84 * auVar105._4_4_,
                                                           (uint)(bVar82 & 1) * (int)fVar159 |
                                                           (uint)!(bool)(bVar82 & 1) *
                                                           auVar105._0_4_))))))));
              auVar105 = vsubps_avx(auVar176,auVar53);
              bVar84 = (bool)((byte)(uVar89 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar89 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar89 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar89 >> 6) & 1);
              bVar21 = SUB81(uVar89 >> 7,0);
              local_200._4_4_ = (uint)bVar84 * (int)fVar146 | (uint)!bVar84 * auVar105._4_4_;
              local_200._0_4_ =
                   (uint)(bVar82 & 1) * (int)fVar167 | (uint)!(bool)(bVar82 & 1) * auVar105._0_4_;
              local_200._8_4_ = (uint)bVar16 * (int)fVar172 | (uint)!bVar16 * auVar105._8_4_;
              local_200._12_4_ = (uint)bVar17 * (int)fVar173 | (uint)!bVar17 * auVar105._12_4_;
              local_200._16_4_ = (uint)bVar18 * (int)fVar140 | (uint)!bVar18 * auVar105._16_4_;
              local_200._20_4_ = (uint)bVar19 * (int)fVar142 | (uint)!bVar19 * auVar105._20_4_;
              local_200._24_4_ = (uint)bVar20 * (int)fVar143 | (uint)!bVar20 * auVar105._24_4_;
              local_200._28_4_ = (uint)bVar21 * auVar99._28_4_ | (uint)!bVar21 * auVar105._28_4_;
            }
          }
        }
        auVar200 = ZEXT3264(local_520);
        auVar199 = ZEXT3264(local_500);
        auVar182 = ZEXT3264(auVar101);
        if (local_2d0 != 0) {
          auVar105 = vsubps_avx(ZEXT1632(auVar9),auVar112);
          auVar104 = auVar178._0_32_;
          auVar94 = vfmadd213ps_fma(auVar105,auVar104,auVar112);
          uVar147 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
          auVar28._4_4_ = uVar147;
          auVar28._0_4_ = uVar147;
          auVar28._8_4_ = uVar147;
          auVar28._12_4_ = uVar147;
          auVar28._16_4_ = uVar147;
          auVar28._20_4_ = uVar147;
          auVar28._24_4_ = uVar147;
          auVar28._28_4_ = uVar147;
          auVar105 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                        CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                 CONCAT44(auVar94._4_4_ +
                                                                          auVar94._4_4_,
                                                                          auVar94._0_4_ +
                                                                          auVar94._0_4_)))),auVar28)
          ;
          auVar103 = auVar157._0_32_;
          uVar148 = vcmpps_avx512vl(auVar103,auVar105,6);
          local_2d0 = local_2d0 & (byte)uVar148;
          if (local_2d0 != 0) {
            auVar153._8_4_ = 0xbf800000;
            auVar153._0_8_ = 0xbf800000bf800000;
            auVar153._12_4_ = 0xbf800000;
            auVar153._16_4_ = 0xbf800000;
            auVar153._20_4_ = 0xbf800000;
            auVar153._24_4_ = 0xbf800000;
            auVar153._28_4_ = 0xbf800000;
            auVar29._8_4_ = 0x40000000;
            auVar29._0_8_ = 0x4000000040000000;
            auVar29._12_4_ = 0x40000000;
            auVar29._16_4_ = 0x40000000;
            auVar29._20_4_ = 0x40000000;
            auVar29._24_4_ = 0x40000000;
            auVar29._28_4_ = 0x40000000;
            local_360 = vfmadd132ps_avx512vl(local_200,auVar153,auVar29);
            local_200 = local_360;
            auVar105 = local_200;
            local_320 = 0;
            if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar84 = true, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar167 = 1.0 / (float)local_5d0._0_4_;
                local_2c0[0] = fVar167 * (auVar178._0_4_ + 0.0);
                local_2c0[1] = fVar167 * (auVar178._4_4_ + 1.0);
                local_2c0[2] = fVar167 * (auVar178._8_4_ + 2.0);
                local_2c0[3] = fVar167 * (auVar178._12_4_ + 3.0);
                fStack_2b0 = fVar167 * (auVar178._16_4_ + 4.0);
                fStack_2ac = fVar167 * (auVar178._20_4_ + 5.0);
                fStack_2a8 = fVar167 * (auVar178._24_4_ + 6.0);
                fStack_2a4 = auVar178._28_4_ + 7.0;
                local_200._0_8_ = local_360._0_8_;
                local_200._8_8_ = local_360._8_8_;
                local_200._16_8_ = local_360._16_8_;
                local_200._24_8_ = local_360._24_8_;
                local_2a0 = local_200._0_8_;
                uStack_298 = local_200._8_8_;
                uStack_290 = local_200._16_8_;
                uStack_288 = local_200._24_8_;
                local_280 = auVar103;
                lVar88 = 0;
                uVar85 = (ulong)local_2d0;
                for (uVar89 = uVar85; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000)
                {
                  lVar88 = lVar88 + 1;
                }
                _local_260 = vpbroadcastd_avx512vl();
                local_600 = vpbroadcastd_avx512vl();
                local_610 = (undefined4)local_5c0;
                uStack_60c = (undefined4)((ulong)local_5c0 >> 0x20);
                bVar84 = true;
                local_620 = local_560;
                uStack_618 = uStack_558;
                uStack_608 = uStack_5b8;
                local_5f0 = *pauVar3;
                local_580 = auVar101;
                local_380 = auVar104;
                local_340 = auVar103;
                local_31c = iVar13;
                local_310 = auVar23;
                local_300 = local_5b0;
                uStack_2f8 = uStack_5a8;
                local_2f0 = local_5c0;
                uStack_2e8 = uStack_5b8;
                local_2e0 = local_560;
                uStack_2d8 = uStack_558;
                local_200 = auVar105;
                do {
                  auVar197 = auVar198._0_16_;
                  local_440 = (float)uVar85;
                  fStack_43c = (float)(uVar85 >> 0x20);
                  uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_3e0 = local_2c0[lVar88];
                  local_240 = (uint)lVar88;
                  uStack_23c = (uint)((ulong)lVar88 >> 0x20);
                  local_3d0 = *(undefined4 *)((long)&local_2a0 + lVar88 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + lVar88 * 4);
                  local_660.context = context->user;
                  fVar146 = 1.0 - local_3e0;
                  fVar167 = fVar146 * fVar146 * -3.0;
                  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar146)),
                                            ZEXT416((uint)(local_3e0 * fVar146)),ZEXT416(0xc0000000)
                                           );
                  auVar93 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar146)),
                                            ZEXT416((uint)(local_3e0 * local_3e0)),
                                            ZEXT416(0x40000000));
                  fVar146 = auVar94._0_4_ * 3.0;
                  fVar172 = auVar93._0_4_ * 3.0;
                  fVar173 = local_3e0 * local_3e0 * 3.0;
                  auVar174._0_4_ = fVar173 * (float)local_620;
                  auVar174._4_4_ = fVar173 * local_620._4_4_;
                  auVar174._8_4_ = fVar173 * (float)uStack_618;
                  auVar174._12_4_ = fVar173 * uStack_618._4_4_;
                  auVar149._4_4_ = fVar172;
                  auVar149._0_4_ = fVar172;
                  auVar149._8_4_ = fVar172;
                  auVar149._12_4_ = fVar172;
                  auVar77._4_4_ = uStack_60c;
                  auVar77._0_4_ = local_610;
                  auVar77._8_8_ = uStack_608;
                  auVar94 = vfmadd132ps_fma(auVar149,auVar174,auVar77);
                  auVar161._4_4_ = fVar146;
                  auVar161._0_4_ = fVar146;
                  auVar161._8_4_ = fVar146;
                  auVar161._12_4_ = fVar146;
                  auVar94 = vfmadd132ps_fma(auVar161,auVar94,local_5f0);
                  auVar150._4_4_ = fVar167;
                  auVar150._0_4_ = fVar167;
                  auVar150._8_4_ = fVar167;
                  auVar150._12_4_ = fVar167;
                  auVar94 = vfmadd213ps_fma(auVar150,auVar23,auVar94);
                  local_410 = auVar94._0_4_;
                  local_400 = vshufps_avx(auVar94,auVar94,0x55);
                  local_3f0 = vshufps_avx(auVar94,auVar94,0xaa);
                  local_3c0 = local_600._0_8_;
                  uStack_3b8 = local_600._8_8_;
                  local_3b0 = _local_260;
                  vpcmpeqd_avx2(ZEXT1632(_local_260),ZEXT1632(_local_260));
                  uStack_39c = (local_660.context)->instID[0];
                  local_3a0 = uStack_39c;
                  uStack_398 = uStack_39c;
                  uStack_394 = uStack_39c;
                  uStack_390 = (local_660.context)->instPrimID[0];
                  uStack_38c = uStack_390;
                  uStack_388 = uStack_390;
                  uStack_384 = uStack_390;
                  local_680 = local_450._0_8_;
                  uStack_678 = local_450._8_8_;
                  local_660.valid = (int *)&local_680;
                  local_660.geometryUserPtr = pGVar14->userPtr;
                  local_660.hit = (RTCHitN *)&local_410;
                  local_660.N = 4;
                  local_5e0._0_4_ = uVar147;
                  local_660.ray = (RTCRayN *)ray;
                  uStack_40c = local_410;
                  uStack_408 = local_410;
                  uStack_404 = local_410;
                  fStack_3dc = local_3e0;
                  fStack_3d8 = local_3e0;
                  fStack_3d4 = local_3e0;
                  uStack_3cc = local_3d0;
                  uStack_3c8 = local_3d0;
                  uStack_3c4 = local_3d0;
                  if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar14->occlusionFilterN)(&local_660);
                    auVar190 = ZEXT1664(local_630);
                    auVar182 = ZEXT3264(local_580);
                    auVar200 = ZEXT3264(local_520);
                    auVar199 = ZEXT3264(local_500);
                    auVar194 = ZEXT3264(local_5a0);
                    auVar195 = ZEXT3264(local_4a0);
                    auVar196 = ZEXT3264(local_480);
                    in_ZMM21 = ZEXT3264(local_4e0);
                    in_ZMM20 = ZEXT3264(local_4c0);
                    auVar94 = vxorps_avx512vl(auVar197,auVar197);
                    auVar198 = ZEXT1664(auVar94);
                    uVar147 = local_5e0._0_4_;
                    uVar86 = local_540._0_4_;
                  }
                  auVar94 = auVar198._0_16_;
                  auVar73._8_8_ = uStack_678;
                  auVar73._0_8_ = local_680;
                  uVar89 = vptestmd_avx512vl(auVar73,auVar73);
                  if ((uVar89 & 0xf) == 0) {
                    uVar85 = CONCAT44(fStack_43c,local_440);
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_660);
                      auVar190 = ZEXT1664(local_630);
                      auVar182 = ZEXT3264(local_580);
                      auVar200 = ZEXT3264(local_520);
                      auVar199 = ZEXT3264(local_500);
                      auVar194 = ZEXT3264(local_5a0);
                      auVar195 = ZEXT3264(local_4a0);
                      auVar196 = ZEXT3264(local_480);
                      in_ZMM21 = ZEXT3264(local_4e0);
                      in_ZMM20 = ZEXT3264(local_4c0);
                      auVar94 = vxorps_avx512vl(auVar94,auVar94);
                      auVar198 = ZEXT1664(auVar94);
                      uVar86 = local_540._0_4_;
                      uVar147 = local_5e0._0_4_;
                    }
                    auVar101 = auVar182._0_32_;
                    auVar74._8_8_ = uStack_678;
                    auVar74._0_8_ = local_680;
                    auVar94 = *(undefined1 (*) [16])(local_660.ray + 0x80);
                    uVar89 = vptestmd_avx512vl(auVar74,auVar74);
                    uVar89 = uVar89 & 0xf;
                    auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar16 = (bool)((byte)uVar89 & 1);
                    auVar97._0_4_ = (uint)bVar16 * auVar93._0_4_ | (uint)!bVar16 * auVar94._0_4_;
                    bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                    auVar97._4_4_ = (uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * auVar94._4_4_;
                    bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
                    auVar97._8_4_ = (uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * auVar94._8_4_;
                    bVar16 = SUB81(uVar89 >> 3,0);
                    auVar97._12_4_ = (uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * auVar94._12_4_;
                    *(undefined1 (*) [16])(local_660.ray + 0x80) = auVar97;
                    uVar85 = CONCAT44(fStack_43c,local_440);
                    local_440 = auVar190._0_4_;
                    if ((byte)uVar89 != 0) break;
                  }
                  auVar101 = auVar182._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar147;
                  lVar88 = 0;
                  uVar85 = uVar85 ^ 1L << ((ulong)local_240 & 0x3f);
                  for (uVar89 = uVar85; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000
                      ) {
                    lVar88 = lVar88 + 1;
                  }
                  bVar84 = uVar85 != 0;
                  local_440 = auVar190._0_4_;
                } while (bVar84);
                auVar178 = ZEXT3264(auVar104);
                auVar157 = ZEXT3264(auVar103);
              }
              goto LAB_01df9755;
            }
          }
        }
        bVar84 = false;
      }
LAB_01df9755:
      if (8 < iVar13) {
        local_540 = vpbroadcastd_avx512vl();
        local_240 = uVar86;
        uStack_23c = uVar86;
        uStack_238 = uVar86;
        uStack_234 = uVar86;
        uStack_230 = uVar86;
        uStack_22c = uVar86;
        uStack_228 = uVar86;
        uStack_224 = uVar86;
        local_260._4_4_ = 1.0 / (float)local_5d0._0_4_;
        local_260._0_4_ = local_260._4_4_;
        fStack_258 = (float)local_260._4_4_;
        fStack_254 = (float)local_260._4_4_;
        fStack_250 = (float)local_260._4_4_;
        fStack_24c = (float)local_260._4_4_;
        fStack_248 = (float)local_260._4_4_;
        fStack_244 = (float)local_260._4_4_;
        local_5d0 = vpbroadcastd_avx512vl();
        local_5e0 = vpbroadcastd_avx512vl();
        lVar88 = 8;
        auVar103 = auVar178._0_32_;
        auVar105 = auVar157._0_32_;
        local_580 = auVar101;
        fStack_43c = local_440;
        fStack_438 = local_440;
        fStack_434 = local_440;
        fStack_430 = local_440;
        fStack_42c = local_440;
        fStack_428 = local_440;
        fStack_424 = local_440;
        do {
          auVar104 = vpbroadcastd_avx512vl();
          auVar106 = vpor_avx2(auVar104,_DAT_0205a920);
          uVar24 = vpcmpd_avx512vl(auVar106,local_540,1);
          auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 * 4 + lVar25);
          auVar118 = *(undefined1 (*) [32])(lVar25 + 0x2227768 + lVar88 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar25 + 0x2227bec + lVar88 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar25 + 0x2228070 + lVar88 * 4);
          local_500 = auVar199._0_32_;
          auVar107 = vmulps_avx512vl(local_500,auVar116);
          local_520 = auVar200._0_32_;
          auVar108 = vmulps_avx512vl(local_520,auVar116);
          auVar54._4_4_ = auVar116._4_4_ * (float)local_140._4_4_;
          auVar54._0_4_ = auVar116._0_4_ * (float)local_140._0_4_;
          auVar54._8_4_ = auVar116._8_4_ * fStack_138;
          auVar54._12_4_ = auVar116._12_4_ * fStack_134;
          auVar54._16_4_ = auVar116._16_4_ * fStack_130;
          auVar54._20_4_ = auVar116._20_4_ * fStack_12c;
          auVar54._24_4_ = auVar116._24_4_ * fStack_128;
          auVar54._28_4_ = auVar106._28_4_;
          auVar106 = vfmadd231ps_avx512vl(auVar107,auVar117,local_e0);
          auVar107 = vfmadd231ps_avx512vl(auVar108,auVar117,local_100);
          auVar108 = vfmadd231ps_avx512vl(auVar54,auVar117,local_120);
          auVar114 = auVar194._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar118,auVar114);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar118,local_1c0);
          auVar94 = vfmadd231ps_fma(auVar108,auVar118,local_c0);
          auVar188 = auVar196._0_32_;
          auVar109 = vfmadd231ps_avx512vl(auVar106,auVar104,auVar188);
          auVar180 = auVar195._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar180);
          auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 * 4 + lVar25);
          auVar107 = *(undefined1 (*) [32])(lVar25 + 0x2229b88 + lVar88 * 4);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar104,local_a0);
          auVar108 = *(undefined1 (*) [32])(lVar25 + 0x222a00c + lVar88 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar25 + 0x222a490 + lVar88 * 4);
          auVar101 = vmulps_avx512vl(local_500,auVar115);
          auVar102 = vmulps_avx512vl(local_520,auVar115);
          auVar55._4_4_ = auVar115._4_4_ * (float)local_140._4_4_;
          auVar55._0_4_ = auVar115._0_4_ * (float)local_140._0_4_;
          auVar55._8_4_ = auVar115._8_4_ * fStack_138;
          auVar55._12_4_ = auVar115._12_4_ * fStack_134;
          auVar55._16_4_ = auVar115._16_4_ * fStack_130;
          auVar55._20_4_ = auVar115._20_4_ * fStack_12c;
          auVar55._24_4_ = auVar115._24_4_ * fStack_128;
          auVar55._28_4_ = uStack_124;
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_e0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,local_100);
          auVar100 = vfmadd231ps_avx512vl(auVar55,auVar108,local_120);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,auVar114);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,local_1c0);
          auVar93 = vfmadd231ps_fma(auVar100,auVar107,local_c0);
          auVar100 = vfmadd231ps_avx512vl(auVar101,auVar106,auVar188);
          auVar110 = vfmadd231ps_avx512vl(auVar102,auVar106,auVar180);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar106,local_a0);
          auVar111 = vmaxps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar93));
          auVar101 = vsubps_avx(auVar100,auVar109);
          auVar102 = vsubps_avx(auVar110,auVar99);
          auVar112 = vmulps_avx512vl(auVar99,auVar101);
          auVar113 = vmulps_avx512vl(auVar109,auVar102);
          auVar112 = vsubps_avx512vl(auVar112,auVar113);
          auVar113 = vmulps_avx512vl(auVar102,auVar102);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar101,auVar101);
          auVar111 = vmulps_avx512vl(auVar111,auVar111);
          auVar111 = vmulps_avx512vl(auVar111,auVar113);
          auVar112 = vmulps_avx512vl(auVar112,auVar112);
          uVar148 = vcmpps_avx512vl(auVar112,auVar111,2);
          local_2d0 = (byte)uVar24 & (byte)uVar148;
          if (local_2d0 == 0) {
            auVar190 = ZEXT3264(auVar180);
            auVar194 = ZEXT3264(auVar114);
          }
          else {
            auVar115 = vmulps_avx512vl(local_580,auVar115);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_1a0,auVar115);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_180,auVar108);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_160,auVar107);
            auVar116 = vmulps_avx512vl(local_580,auVar116);
            auVar117 = vfmadd213ps_avx512vl(auVar117,local_1a0,auVar116);
            auVar118 = vfmadd213ps_avx512vl(auVar118,local_180,auVar117);
            auVar107 = vfmadd213ps_avx512vl(auVar104,local_160,auVar118);
            auVar104 = *(undefined1 (*) [32])(lVar25 + 0x22284f4 + lVar88 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar25 + 0x2228978 + lVar88 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar25 + 0x2228dfc + lVar88 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar25 + 0x2229280 + lVar88 * 4);
            auVar108 = vmulps_avx512vl(local_500,auVar116);
            auVar115 = vmulps_avx512vl(local_520,auVar116);
            auVar116 = vmulps_avx512vl(local_580,auVar116);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar117,local_e0);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar117,local_100);
            auVar117 = vfmadd231ps_avx512vl(auVar116,local_1a0,auVar117);
            auVar116 = vfmadd231ps_avx512vl(auVar108,auVar118,auVar114);
            auVar108 = vfmadd231ps_avx512vl(auVar115,auVar118,local_1c0);
            auVar118 = vfmadd231ps_avx512vl(auVar117,local_180,auVar118);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar104,auVar188);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar180);
            auVar115 = vfmadd231ps_avx512vl(auVar118,local_160,auVar104);
            auVar104 = *(undefined1 (*) [32])(lVar25 + 0x222a914 + lVar88 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar25 + 0x222b21c + lVar88 * 4);
            auVar117 = *(undefined1 (*) [32])(lVar25 + 0x222b6a0 + lVar88 * 4);
            auVar111 = vmulps_avx512vl(local_500,auVar117);
            auVar112 = vmulps_avx512vl(local_520,auVar117);
            auVar117 = vmulps_avx512vl(local_580,auVar117);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar118,local_e0);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,local_100);
            auVar117 = vfmadd231ps_avx512vl(auVar117,local_1a0,auVar118);
            auVar118 = *(undefined1 (*) [32])(lVar25 + 0x222ad98 + lVar88 * 4);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar118,auVar114);
            auVar197 = vfmadd231ps_fma(auVar112,auVar118,local_1c0);
            auVar118 = vfmadd231ps_avx512vl(auVar117,local_180,auVar118);
            auVar117 = vfmadd231ps_avx512vl(auVar111,auVar104,auVar188);
            auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar197),auVar104,auVar180);
            auVar118 = vfmadd231ps_avx512vl(auVar118,local_160,auVar104);
            auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar116,auVar112);
            vandps_avx512vl(auVar108,auVar112);
            auVar104 = vmaxps_avx(auVar112,auVar112);
            vandps_avx512vl(auVar115,auVar112);
            auVar104 = vmaxps_avx(auVar104,auVar112);
            auVar78._4_4_ = fStack_43c;
            auVar78._0_4_ = local_440;
            auVar78._8_4_ = fStack_438;
            auVar78._12_4_ = fStack_434;
            auVar78._16_4_ = fStack_430;
            auVar78._20_4_ = fStack_42c;
            auVar78._24_4_ = fStack_428;
            auVar78._28_4_ = fStack_424;
            uVar89 = vcmpps_avx512vl(auVar104,auVar78,1);
            bVar16 = (bool)((byte)uVar89 & 1);
            auVar129._0_4_ = (float)((uint)bVar16 * auVar101._0_4_ | (uint)!bVar16 * auVar116._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar116._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar116._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar116._12_4_);
            bVar16 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * auVar116._16_4_);
            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * auVar116._20_4_);
            bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * auVar116._24_4_);
            bVar16 = SUB81(uVar89 >> 7,0);
            auVar129._28_4_ = (uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar116._28_4_;
            bVar16 = (bool)((byte)uVar89 & 1);
            auVar130._0_4_ = (float)((uint)bVar16 * auVar102._0_4_ | (uint)!bVar16 * auVar108._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar108._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar108._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar108._12_4_);
            bVar16 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar130._16_4_ =
                 (float)((uint)bVar16 * auVar102._16_4_ | (uint)!bVar16 * auVar108._16_4_);
            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar130._20_4_ =
                 (float)((uint)bVar16 * auVar102._20_4_ | (uint)!bVar16 * auVar108._20_4_);
            bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar130._24_4_ =
                 (float)((uint)bVar16 * auVar102._24_4_ | (uint)!bVar16 * auVar108._24_4_);
            bVar16 = SUB81(uVar89 >> 7,0);
            auVar130._28_4_ = (uint)bVar16 * auVar102._28_4_ | (uint)!bVar16 * auVar108._28_4_;
            vandps_avx512vl(auVar117,auVar112);
            vandps_avx512vl(auVar111,auVar112);
            auVar104 = vmaxps_avx(auVar130,auVar130);
            vandps_avx512vl(auVar118,auVar112);
            auVar104 = vmaxps_avx(auVar104,auVar130);
            uVar89 = vcmpps_avx512vl(auVar104,auVar78,1);
            bVar16 = (bool)((byte)uVar89 & 1);
            auVar131._0_4_ = (uint)bVar16 * auVar101._0_4_ | (uint)!bVar16 * auVar117._0_4_;
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar131._4_4_ = (uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar117._4_4_;
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar131._8_4_ = (uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar117._8_4_;
            bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar131._12_4_ = (uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar117._12_4_;
            bVar16 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar131._16_4_ = (uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * auVar117._16_4_;
            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar131._20_4_ = (uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * auVar117._20_4_;
            bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar131._24_4_ = (uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * auVar117._24_4_;
            bVar16 = SUB81(uVar89 >> 7,0);
            auVar131._28_4_ = (uint)bVar16 * auVar101._28_4_ | (uint)!bVar16 * auVar117._28_4_;
            bVar16 = (bool)((byte)uVar89 & 1);
            auVar132._0_4_ = (float)((uint)bVar16 * auVar102._0_4_ | (uint)!bVar16 * auVar111._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar111._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar111._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar111._12_4_);
            bVar16 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar132._16_4_ =
                 (float)((uint)bVar16 * auVar102._16_4_ | (uint)!bVar16 * auVar111._16_4_);
            bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar132._20_4_ =
                 (float)((uint)bVar16 * auVar102._20_4_ | (uint)!bVar16 * auVar111._20_4_);
            bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar132._24_4_ =
                 (float)((uint)bVar16 * auVar102._24_4_ | (uint)!bVar16 * auVar111._24_4_);
            bVar16 = SUB81(uVar89 >> 7,0);
            auVar132._28_4_ = (uint)bVar16 * auVar102._28_4_ | (uint)!bVar16 * auVar111._28_4_;
            auVar184._8_4_ = 0x80000000;
            auVar184._0_8_ = 0x8000000080000000;
            auVar184._12_4_ = 0x80000000;
            auVar184._16_4_ = 0x80000000;
            auVar184._20_4_ = 0x80000000;
            auVar184._24_4_ = 0x80000000;
            auVar184._28_4_ = 0x80000000;
            auVar104 = vxorps_avx512vl(auVar131,auVar184);
            auVar111 = auVar198._0_32_;
            auVar118 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar111);
            auVar197 = vfmadd231ps_fma(auVar118,auVar130,auVar130);
            auVar118 = vrsqrt14ps_avx512vl(ZEXT1632(auVar197));
            auVar193._8_4_ = 0xbf000000;
            auVar193._0_8_ = 0xbf000000bf000000;
            auVar193._12_4_ = 0xbf000000;
            auVar193._16_4_ = 0xbf000000;
            auVar193._20_4_ = 0xbf000000;
            auVar193._24_4_ = 0xbf000000;
            auVar193._28_4_ = 0xbf000000;
            fVar167 = auVar118._0_4_;
            fVar146 = auVar118._4_4_;
            fVar172 = auVar118._8_4_;
            fVar173 = auVar118._12_4_;
            fVar159 = auVar118._16_4_;
            fVar166 = auVar118._20_4_;
            fVar90 = auVar118._24_4_;
            auVar56._4_4_ = fVar146 * fVar146 * fVar146 * auVar197._4_4_ * -0.5;
            auVar56._0_4_ = fVar167 * fVar167 * fVar167 * auVar197._0_4_ * -0.5;
            auVar56._8_4_ = fVar172 * fVar172 * fVar172 * auVar197._8_4_ * -0.5;
            auVar56._12_4_ = fVar173 * fVar173 * fVar173 * auVar197._12_4_ * -0.5;
            auVar56._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
            auVar56._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
            auVar56._24_4_ = fVar90 * fVar90 * fVar90 * -0.0;
            auVar56._28_4_ = auVar130._28_4_;
            auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar118 = vfmadd231ps_avx512vl(auVar56,auVar117,auVar118);
            auVar57._4_4_ = auVar130._4_4_ * auVar118._4_4_;
            auVar57._0_4_ = auVar130._0_4_ * auVar118._0_4_;
            auVar57._8_4_ = auVar130._8_4_ * auVar118._8_4_;
            auVar57._12_4_ = auVar130._12_4_ * auVar118._12_4_;
            auVar57._16_4_ = auVar130._16_4_ * auVar118._16_4_;
            auVar57._20_4_ = auVar130._20_4_ * auVar118._20_4_;
            auVar57._24_4_ = auVar130._24_4_ * auVar118._24_4_;
            auVar57._28_4_ = 0;
            auVar58._4_4_ = auVar118._4_4_ * -auVar129._4_4_;
            auVar58._0_4_ = auVar118._0_4_ * -auVar129._0_4_;
            auVar58._8_4_ = auVar118._8_4_ * -auVar129._8_4_;
            auVar58._12_4_ = auVar118._12_4_ * -auVar129._12_4_;
            auVar58._16_4_ = auVar118._16_4_ * -auVar129._16_4_;
            auVar58._20_4_ = auVar118._20_4_ * -auVar129._20_4_;
            auVar58._24_4_ = auVar118._24_4_ * -auVar129._24_4_;
            auVar58._28_4_ = auVar130._28_4_;
            auVar116 = vmulps_avx512vl(auVar118,auVar111);
            auVar118 = vfmadd213ps_avx512vl(auVar131,auVar131,auVar111);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar132,auVar132);
            auVar108 = vrsqrt14ps_avx512vl(auVar118);
            auVar118 = vmulps_avx512vl(auVar118,auVar193);
            fVar167 = auVar108._0_4_;
            fVar146 = auVar108._4_4_;
            fVar172 = auVar108._8_4_;
            fVar173 = auVar108._12_4_;
            fVar159 = auVar108._16_4_;
            fVar166 = auVar108._20_4_;
            fVar90 = auVar108._24_4_;
            auVar59._4_4_ = fVar146 * fVar146 * fVar146 * auVar118._4_4_;
            auVar59._0_4_ = fVar167 * fVar167 * fVar167 * auVar118._0_4_;
            auVar59._8_4_ = fVar172 * fVar172 * fVar172 * auVar118._8_4_;
            auVar59._12_4_ = fVar173 * fVar173 * fVar173 * auVar118._12_4_;
            auVar59._16_4_ = fVar159 * fVar159 * fVar159 * auVar118._16_4_;
            auVar59._20_4_ = fVar166 * fVar166 * fVar166 * auVar118._20_4_;
            auVar59._24_4_ = fVar90 * fVar90 * fVar90 * auVar118._24_4_;
            auVar59._28_4_ = auVar118._28_4_;
            auVar118 = vfmadd231ps_avx512vl(auVar59,auVar117,auVar108);
            auVar60._4_4_ = auVar132._4_4_ * auVar118._4_4_;
            auVar60._0_4_ = auVar132._0_4_ * auVar118._0_4_;
            auVar60._8_4_ = auVar132._8_4_ * auVar118._8_4_;
            auVar60._12_4_ = auVar132._12_4_ * auVar118._12_4_;
            auVar60._16_4_ = auVar132._16_4_ * auVar118._16_4_;
            auVar60._20_4_ = auVar132._20_4_ * auVar118._20_4_;
            auVar60._24_4_ = auVar132._24_4_ * auVar118._24_4_;
            auVar60._28_4_ = auVar108._28_4_;
            auVar61._4_4_ = auVar118._4_4_ * auVar104._4_4_;
            auVar61._0_4_ = auVar118._0_4_ * auVar104._0_4_;
            auVar61._8_4_ = auVar118._8_4_ * auVar104._8_4_;
            auVar61._12_4_ = auVar118._12_4_ * auVar104._12_4_;
            auVar61._16_4_ = auVar118._16_4_ * auVar104._16_4_;
            auVar61._20_4_ = auVar118._20_4_ * auVar104._20_4_;
            auVar61._24_4_ = auVar118._24_4_ * auVar104._24_4_;
            auVar61._28_4_ = auVar104._28_4_;
            auVar104 = vmulps_avx512vl(auVar118,auVar111);
            auVar197 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar94),auVar109);
            auVar118 = ZEXT1632(auVar94);
            auVar8 = vfmadd213ps_fma(auVar58,auVar118,auVar99);
            auVar117 = vfmadd213ps_avx512vl(auVar116,auVar118,auVar107);
            auVar108 = vfmadd213ps_avx512vl(auVar60,ZEXT1632(auVar93),auVar100);
            auVar156 = vfnmadd213ps_fma(auVar57,auVar118,auVar109);
            auVar115 = ZEXT1632(auVar93);
            auVar9 = vfmadd213ps_fma(auVar61,auVar115,auVar110);
            auVar95 = vfnmadd213ps_fma(auVar58,auVar118,auVar99);
            auVar92 = vfmadd213ps_fma(auVar104,auVar115,auVar106);
            auVar99 = ZEXT1632(auVar94);
            auVar96 = vfnmadd231ps_fma(auVar107,auVar99,auVar116);
            auVar160 = vfnmadd213ps_fma(auVar60,auVar115,auVar100);
            auVar179 = vfnmadd213ps_fma(auVar61,auVar115,auVar110);
            auVar183 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar93),auVar104);
            auVar106 = vsubps_avx512vl(auVar108,ZEXT1632(auVar156));
            auVar104 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar95));
            auVar118 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar96));
            auVar62._4_4_ = auVar104._4_4_ * auVar96._4_4_;
            auVar62._0_4_ = auVar104._0_4_ * auVar96._0_4_;
            auVar62._8_4_ = auVar104._8_4_ * auVar96._8_4_;
            auVar62._12_4_ = auVar104._12_4_ * auVar96._12_4_;
            auVar62._16_4_ = auVar104._16_4_ * 0.0;
            auVar62._20_4_ = auVar104._20_4_ * 0.0;
            auVar62._24_4_ = auVar104._24_4_ * 0.0;
            auVar62._28_4_ = auVar116._28_4_;
            auVar94 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar95),auVar118);
            auVar63._4_4_ = auVar118._4_4_ * auVar156._4_4_;
            auVar63._0_4_ = auVar118._0_4_ * auVar156._0_4_;
            auVar63._8_4_ = auVar118._8_4_ * auVar156._8_4_;
            auVar63._12_4_ = auVar118._12_4_ * auVar156._12_4_;
            auVar63._16_4_ = auVar118._16_4_ * 0.0;
            auVar63._20_4_ = auVar118._20_4_ * 0.0;
            auVar63._24_4_ = auVar118._24_4_ * 0.0;
            auVar63._28_4_ = auVar118._28_4_;
            auVar10 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar96),auVar106);
            auVar64._4_4_ = auVar95._4_4_ * auVar106._4_4_;
            auVar64._0_4_ = auVar95._0_4_ * auVar106._0_4_;
            auVar64._8_4_ = auVar95._8_4_ * auVar106._8_4_;
            auVar64._12_4_ = auVar95._12_4_ * auVar106._12_4_;
            auVar64._16_4_ = auVar106._16_4_ * 0.0;
            auVar64._20_4_ = auVar106._20_4_ * 0.0;
            auVar64._24_4_ = auVar106._24_4_ * 0.0;
            auVar64._28_4_ = auVar106._28_4_;
            auVar11 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar156),auVar104);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar111,ZEXT1632(auVar10));
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,ZEXT1632(auVar94));
            uVar89 = vcmpps_avx512vl(auVar104,auVar111,2);
            bVar82 = (byte)uVar89;
            fVar138 = (float)((uint)(bVar82 & 1) * auVar197._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * auVar160._0_4_);
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            fVar140 = (float)((uint)bVar16 * auVar197._4_4_ | (uint)!bVar16 * auVar160._4_4_);
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            fVar143 = (float)((uint)bVar16 * auVar197._8_4_ | (uint)!bVar16 * auVar160._8_4_);
            bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
            fVar144 = (float)((uint)bVar16 * auVar197._12_4_ | (uint)!bVar16 * auVar160._12_4_);
            auVar115 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar143,CONCAT44(fVar140,fVar138))));
            fVar139 = (float)((uint)(bVar82 & 1) * auVar8._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * auVar179._0_4_);
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            fVar142 = (float)((uint)bVar16 * auVar8._4_4_ | (uint)!bVar16 * auVar179._4_4_);
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            fVar141 = (float)((uint)bVar16 * auVar8._8_4_ | (uint)!bVar16 * auVar179._8_4_);
            bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
            fVar145 = (float)((uint)bVar16 * auVar8._12_4_ | (uint)!bVar16 * auVar179._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar141,CONCAT44(fVar142,fVar139))));
            auVar133._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar117._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar183._0_4_);
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * auVar183._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * auVar183._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * auVar183._12_4_);
            fVar167 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar117._16_4_);
            auVar133._16_4_ = fVar167;
            fVar146 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar117._20_4_);
            auVar133._20_4_ = fVar146;
            fVar172 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar117._24_4_);
            auVar133._24_4_ = fVar172;
            iVar1 = (uint)(byte)(uVar89 >> 7) * auVar117._28_4_;
            auVar133._28_4_ = iVar1;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar156),auVar108);
            auVar134._0_4_ =
                 (uint)(bVar82 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar94._0_4_;
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar94._4_4_;
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar94._8_4_;
            bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar94._12_4_;
            auVar134._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar104._16_4_;
            auVar134._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar104._20_4_;
            auVar134._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar104._24_4_;
            auVar134._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar9));
            auVar135._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar197._0_4_);
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar197._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar197._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar197._12_4_);
            fVar166 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar104._16_4_);
            auVar135._16_4_ = fVar166;
            fVar159 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar104._20_4_);
            auVar135._20_4_ = fVar159;
            fVar173 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar104._24_4_);
            auVar135._24_4_ = fVar173;
            auVar135._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar104._28_4_;
            auVar104 = vblendmps_avx512vl(ZEXT1632(auVar96),ZEXT1632(auVar92));
            auVar136._0_4_ =
                 (float)((uint)(bVar82 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar8._0_4_);
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar8._4_4_);
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar8._8_4_);
            bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar8._12_4_);
            fVar90 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar104._16_4_);
            auVar136._16_4_ = fVar90;
            fVar158 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar104._20_4_);
            auVar136._20_4_ = fVar158;
            fVar91 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar104._24_4_);
            auVar136._24_4_ = fVar91;
            iVar2 = (uint)(byte)(uVar89 >> 7) * auVar104._28_4_;
            auVar136._28_4_ = iVar2;
            auVar137._0_4_ =
                 (uint)(bVar82 & 1) * (int)auVar156._0_4_ |
                 (uint)!(bool)(bVar82 & 1) * auVar108._0_4_;
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar137._4_4_ = (uint)bVar16 * (int)auVar156._4_4_ | (uint)!bVar16 * auVar108._4_4_;
            bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar137._8_4_ = (uint)bVar16 * (int)auVar156._8_4_ | (uint)!bVar16 * auVar108._8_4_;
            bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar137._12_4_ = (uint)bVar16 * (int)auVar156._12_4_ | (uint)!bVar16 * auVar108._12_4_;
            auVar137._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar108._16_4_;
            auVar137._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar108._20_4_;
            auVar137._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar108._24_4_;
            auVar137._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar108._28_4_;
            bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar89 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar108 = vsubps_avx512vl(auVar137,auVar115);
            auVar118 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar95._12_4_ |
                                                     (uint)!bVar20 * auVar9._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar95._8_4_ |
                                                              (uint)!bVar18 * auVar9._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar95._4_4_ |
                                                                       (uint)!bVar16 * auVar9._4_4_,
                                                                       (uint)(bVar82 & 1) *
                                                                       (int)auVar95._0_4_ |
                                                                       (uint)!(bool)(bVar82 & 1) *
                                                                       auVar9._0_4_)))),auVar101);
            auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar96._12_4_ |
                                                     (uint)!bVar21 * auVar92._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar96._8_4_ |
                                                              (uint)!bVar19 * auVar92._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar96._4_4_ |
                                                                       (uint)!bVar17 * auVar92._4_4_
                                                                       ,(uint)(bVar82 & 1) *
                                                                        (int)auVar96._0_4_ |
                                                                        (uint)!(bool)(bVar82 & 1) *
                                                                        auVar92._0_4_)))),auVar133);
            auVar116 = vsubps_avx(auVar115,auVar134);
            auVar106 = vsubps_avx(auVar101,auVar135);
            auVar107 = vsubps_avx(auVar133,auVar136);
            auVar65._4_4_ = auVar117._4_4_ * fVar140;
            auVar65._0_4_ = auVar117._0_4_ * fVar138;
            auVar65._8_4_ = auVar117._8_4_ * fVar143;
            auVar65._12_4_ = auVar117._12_4_ * fVar144;
            auVar65._16_4_ = auVar117._16_4_ * 0.0;
            auVar65._20_4_ = auVar117._20_4_ * 0.0;
            auVar65._24_4_ = auVar117._24_4_ * 0.0;
            auVar65._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar65,auVar133,auVar108);
            auVar165._0_4_ = fVar139 * auVar108._0_4_;
            auVar165._4_4_ = fVar142 * auVar108._4_4_;
            auVar165._8_4_ = fVar141 * auVar108._8_4_;
            auVar165._12_4_ = fVar145 * auVar108._12_4_;
            auVar165._16_4_ = auVar108._16_4_ * 0.0;
            auVar165._20_4_ = auVar108._20_4_ * 0.0;
            auVar165._24_4_ = auVar108._24_4_ * 0.0;
            auVar165._28_4_ = 0;
            auVar197 = vfmsub231ps_fma(auVar165,auVar115,auVar118);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar197),auVar111,ZEXT1632(auVar94));
            auVar170._0_4_ = auVar118._0_4_ * auVar133._0_4_;
            auVar170._4_4_ = auVar118._4_4_ * auVar133._4_4_;
            auVar170._8_4_ = auVar118._8_4_ * auVar133._8_4_;
            auVar170._12_4_ = auVar118._12_4_ * auVar133._12_4_;
            auVar170._16_4_ = auVar118._16_4_ * fVar167;
            auVar170._20_4_ = auVar118._20_4_ * fVar146;
            auVar170._24_4_ = auVar118._24_4_ * fVar172;
            auVar170._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar170,auVar101,auVar117);
            auVar102 = vfmadd231ps_avx512vl(auVar104,auVar111,ZEXT1632(auVar94));
            auVar104 = vmulps_avx512vl(auVar107,auVar134);
            auVar104 = vfmsub231ps_avx512vl(auVar104,auVar116,auVar136);
            auVar66._4_4_ = auVar106._4_4_ * auVar136._4_4_;
            auVar66._0_4_ = auVar106._0_4_ * auVar136._0_4_;
            auVar66._8_4_ = auVar106._8_4_ * auVar136._8_4_;
            auVar66._12_4_ = auVar106._12_4_ * auVar136._12_4_;
            auVar66._16_4_ = auVar106._16_4_ * fVar90;
            auVar66._20_4_ = auVar106._20_4_ * fVar158;
            auVar66._24_4_ = auVar106._24_4_ * fVar91;
            auVar66._28_4_ = iVar2;
            auVar94 = vfmsub231ps_fma(auVar66,auVar135,auVar107);
            auVar171._0_4_ = auVar135._0_4_ * auVar116._0_4_;
            auVar171._4_4_ = auVar135._4_4_ * auVar116._4_4_;
            auVar171._8_4_ = auVar135._8_4_ * auVar116._8_4_;
            auVar171._12_4_ = auVar135._12_4_ * auVar116._12_4_;
            auVar171._16_4_ = fVar166 * auVar116._16_4_;
            auVar171._20_4_ = fVar159 * auVar116._20_4_;
            auVar171._24_4_ = fVar173 * auVar116._24_4_;
            auVar171._28_4_ = 0;
            auVar197 = vfmsub231ps_fma(auVar171,auVar106,auVar134);
            auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar197),auVar111,auVar104);
            auVar109 = vfmadd231ps_avx512vl(auVar104,auVar111,ZEXT1632(auVar94));
            auVar104 = vmaxps_avx(auVar102,auVar109);
            uVar148 = vcmpps_avx512vl(auVar104,auVar111,2);
            local_2d0 = local_2d0 & (byte)uVar148;
            auVar190 = ZEXT3264(auVar180);
            if (local_2d0 == 0) {
LAB_01dfa36b:
              local_2d0 = 0;
            }
            else {
              auVar67._4_4_ = auVar107._4_4_ * auVar118._4_4_;
              auVar67._0_4_ = auVar107._0_4_ * auVar118._0_4_;
              auVar67._8_4_ = auVar107._8_4_ * auVar118._8_4_;
              auVar67._12_4_ = auVar107._12_4_ * auVar118._12_4_;
              auVar67._16_4_ = auVar107._16_4_ * auVar118._16_4_;
              auVar67._20_4_ = auVar107._20_4_ * auVar118._20_4_;
              auVar67._24_4_ = auVar107._24_4_ * auVar118._24_4_;
              auVar67._28_4_ = auVar104._28_4_;
              auVar8 = vfmsub231ps_fma(auVar67,auVar106,auVar117);
              auVar68._4_4_ = auVar117._4_4_ * auVar116._4_4_;
              auVar68._0_4_ = auVar117._0_4_ * auVar116._0_4_;
              auVar68._8_4_ = auVar117._8_4_ * auVar116._8_4_;
              auVar68._12_4_ = auVar117._12_4_ * auVar116._12_4_;
              auVar68._16_4_ = auVar117._16_4_ * auVar116._16_4_;
              auVar68._20_4_ = auVar117._20_4_ * auVar116._20_4_;
              auVar68._24_4_ = auVar117._24_4_ * auVar116._24_4_;
              auVar68._28_4_ = auVar117._28_4_;
              auVar197 = vfmsub231ps_fma(auVar68,auVar108,auVar107);
              auVar69._4_4_ = auVar106._4_4_ * auVar108._4_4_;
              auVar69._0_4_ = auVar106._0_4_ * auVar108._0_4_;
              auVar69._8_4_ = auVar106._8_4_ * auVar108._8_4_;
              auVar69._12_4_ = auVar106._12_4_ * auVar108._12_4_;
              auVar69._16_4_ = auVar106._16_4_ * auVar108._16_4_;
              auVar69._20_4_ = auVar106._20_4_ * auVar108._20_4_;
              auVar69._24_4_ = auVar106._24_4_ * auVar108._24_4_;
              auVar69._28_4_ = auVar106._28_4_;
              auVar9 = vfmsub231ps_fma(auVar69,auVar116,auVar118);
              auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar197),ZEXT1632(auVar9));
              auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar8),auVar111);
              auVar118 = vrcp14ps_avx512vl(auVar104);
              auVar31._8_4_ = 0x3f800000;
              auVar31._0_8_ = &DAT_3f8000003f800000;
              auVar31._12_4_ = 0x3f800000;
              auVar31._16_4_ = 0x3f800000;
              auVar31._20_4_ = 0x3f800000;
              auVar31._24_4_ = 0x3f800000;
              auVar31._28_4_ = 0x3f800000;
              auVar117 = vfnmadd213ps_avx512vl(auVar118,auVar104,auVar31);
              auVar94 = vfmadd132ps_fma(auVar117,auVar118,auVar118);
              auVar70._4_4_ = auVar9._4_4_ * auVar133._4_4_;
              auVar70._0_4_ = auVar9._0_4_ * auVar133._0_4_;
              auVar70._8_4_ = auVar9._8_4_ * auVar133._8_4_;
              auVar70._12_4_ = auVar9._12_4_ * auVar133._12_4_;
              auVar70._16_4_ = fVar167 * 0.0;
              auVar70._20_4_ = fVar146 * 0.0;
              auVar70._24_4_ = fVar172 * 0.0;
              auVar70._28_4_ = iVar1;
              auVar197 = vfmadd231ps_fma(auVar70,auVar101,ZEXT1632(auVar197));
              auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar115,ZEXT1632(auVar8));
              fVar167 = auVar94._0_4_;
              fVar146 = auVar94._4_4_;
              fVar172 = auVar94._8_4_;
              fVar173 = auVar94._12_4_;
              auVar118 = ZEXT1632(CONCAT412(auVar197._12_4_ * fVar173,
                                            CONCAT48(auVar197._8_4_ * fVar172,
                                                     CONCAT44(auVar197._4_4_ * fVar146,
                                                              auVar197._0_4_ * fVar167))));
              auVar79._4_4_ = uStack_23c;
              auVar79._0_4_ = local_240;
              auVar79._8_4_ = uStack_238;
              auVar79._12_4_ = uStack_234;
              auVar79._16_4_ = uStack_230;
              auVar79._20_4_ = uStack_22c;
              auVar79._24_4_ = uStack_228;
              auVar79._28_4_ = uStack_224;
              uVar148 = vcmpps_avx512vl(auVar118,auVar79,0xd);
              uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar32._4_4_ = uVar147;
              auVar32._0_4_ = uVar147;
              auVar32._8_4_ = uVar147;
              auVar32._12_4_ = uVar147;
              auVar32._16_4_ = uVar147;
              auVar32._20_4_ = uVar147;
              auVar32._24_4_ = uVar147;
              auVar32._28_4_ = uVar147;
              uVar24 = vcmpps_avx512vl(auVar118,auVar32,2);
              local_2d0 = (byte)uVar148 & (byte)uVar24 & local_2d0;
              if (local_2d0 == 0) goto LAB_01dfa36b;
              uVar148 = vcmpps_avx512vl(auVar104,auVar111,4);
              if ((local_2d0 & (byte)uVar148) == 0) {
                local_2d0 = 0;
              }
              else {
                local_2d0 = local_2d0 & (byte)uVar148;
                fVar159 = auVar102._0_4_ * fVar167;
                fVar166 = auVar102._4_4_ * fVar146;
                auVar71._4_4_ = fVar166;
                auVar71._0_4_ = fVar159;
                fVar90 = auVar102._8_4_ * fVar172;
                auVar71._8_4_ = fVar90;
                fVar91 = auVar102._12_4_ * fVar173;
                auVar71._12_4_ = fVar91;
                fVar158 = auVar102._16_4_ * 0.0;
                auVar71._16_4_ = fVar158;
                fVar138 = auVar102._20_4_ * 0.0;
                auVar71._20_4_ = fVar138;
                fVar139 = auVar102._24_4_ * 0.0;
                auVar71._24_4_ = fVar139;
                auVar71._28_4_ = auVar102._28_4_;
                fVar167 = auVar109._0_4_ * fVar167;
                fVar146 = auVar109._4_4_ * fVar146;
                auVar72._4_4_ = fVar146;
                auVar72._0_4_ = fVar167;
                fVar172 = auVar109._8_4_ * fVar172;
                auVar72._8_4_ = fVar172;
                fVar173 = auVar109._12_4_ * fVar173;
                auVar72._12_4_ = fVar173;
                fVar140 = auVar109._16_4_ * 0.0;
                auVar72._16_4_ = fVar140;
                fVar142 = auVar109._20_4_ * 0.0;
                auVar72._20_4_ = fVar142;
                fVar143 = auVar109._24_4_ * 0.0;
                auVar72._24_4_ = fVar143;
                auVar72._28_4_ = auVar109._28_4_;
                auVar177._8_4_ = 0x3f800000;
                auVar177._0_8_ = &DAT_3f8000003f800000;
                auVar177._12_4_ = 0x3f800000;
                auVar177._16_4_ = 0x3f800000;
                auVar177._20_4_ = 0x3f800000;
                auVar177._24_4_ = 0x3f800000;
                auVar177._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx512vl(auVar177,auVar71);
                bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar89 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar89 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar89 >> 6) & 1);
                bVar22 = SUB81(uVar89 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar22 * auVar102._28_4_ |
                                              (uint)!bVar22 * auVar104._28_4_,
                                              CONCAT424((uint)bVar21 * (int)fVar139 |
                                                        (uint)!bVar21 * auVar104._24_4_,
                                                        CONCAT420((uint)bVar20 * (int)fVar138 |
                                                                  (uint)!bVar20 * auVar104._20_4_,
                                                                  CONCAT416((uint)bVar19 *
                                                                            (int)fVar158 |
                                                                            (uint)!bVar19 *
                                                                            auVar104._16_4_,
                                                                            CONCAT412((uint)bVar18 *
                                                                                      (int)fVar91 |
                                                                                      (uint)!bVar18
                                                                                      * auVar104.
                                                  _12_4_,CONCAT48((uint)bVar17 * (int)fVar90 |
                                                                  (uint)!bVar17 * auVar104._8_4_,
                                                                  CONCAT44((uint)bVar16 *
                                                                           (int)fVar166 |
                                                                           (uint)!bVar16 *
                                                                           auVar104._4_4_,
                                                                           (uint)(bVar82 & 1) *
                                                                           (int)fVar159 |
                                                                           (uint)!(bool)(bVar82 & 1)
                                                                           * auVar104._0_4_))))))));
                auVar104 = vsubps_avx(auVar177,auVar72);
                bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar89 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar89 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar89 >> 6) & 1);
                bVar22 = SUB81(uVar89 >> 7,0);
                local_220._4_4_ = (uint)bVar16 * (int)fVar146 | (uint)!bVar16 * auVar104._4_4_;
                local_220._0_4_ =
                     (uint)(bVar82 & 1) * (int)fVar167 | (uint)!(bool)(bVar82 & 1) * auVar104._0_4_;
                local_220._8_4_ = (uint)bVar17 * (int)fVar172 | (uint)!bVar17 * auVar104._8_4_;
                local_220._12_4_ = (uint)bVar18 * (int)fVar173 | (uint)!bVar18 * auVar104._12_4_;
                local_220._16_4_ = (uint)bVar19 * (int)fVar140 | (uint)!bVar19 * auVar104._16_4_;
                local_220._20_4_ = (uint)bVar20 * (int)fVar142 | (uint)!bVar20 * auVar104._20_4_;
                local_220._24_4_ = (uint)bVar21 * (int)fVar143 | (uint)!bVar21 * auVar104._24_4_;
                local_220._28_4_ = (uint)bVar22 * auVar109._28_4_ | (uint)!bVar22 * auVar104._28_4_;
                in_ZMM21 = ZEXT3264(auVar118);
              }
            }
            auVar194 = ZEXT3264(local_5a0);
            if (local_2d0 != 0) {
              auVar104 = vsubps_avx(ZEXT1632(auVar93),auVar99);
              local_4c0 = in_ZMM20._0_32_;
              auVar104 = vfmadd213ps_avx512vl(auVar104,local_4c0,auVar99);
              auVar154._0_4_ = auVar104._0_4_ + auVar104._0_4_;
              auVar154._4_4_ = auVar104._4_4_ + auVar104._4_4_;
              auVar154._8_4_ = auVar104._8_4_ + auVar104._8_4_;
              auVar154._12_4_ = auVar104._12_4_ + auVar104._12_4_;
              auVar154._16_4_ = auVar104._16_4_ + auVar104._16_4_;
              auVar154._20_4_ = auVar104._20_4_ + auVar104._20_4_;
              auVar154._24_4_ = auVar104._24_4_ + auVar104._24_4_;
              auVar154._28_4_ = auVar104._28_4_ + auVar104._28_4_;
              uVar147 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
              auVar33._4_4_ = uVar147;
              auVar33._0_4_ = uVar147;
              auVar33._8_4_ = uVar147;
              auVar33._12_4_ = uVar147;
              auVar33._16_4_ = uVar147;
              auVar33._20_4_ = uVar147;
              auVar33._24_4_ = uVar147;
              auVar33._28_4_ = uVar147;
              auVar104 = vmulps_avx512vl(auVar154,auVar33);
              local_4e0 = in_ZMM21._0_32_;
              uVar148 = vcmpps_avx512vl(local_4e0,auVar104,6);
              local_2d0 = local_2d0 & (byte)uVar148;
              if (local_2d0 != 0) {
                auVar155._8_4_ = 0xbf800000;
                auVar155._0_8_ = 0xbf800000bf800000;
                auVar155._12_4_ = 0xbf800000;
                auVar155._16_4_ = 0xbf800000;
                auVar155._20_4_ = 0xbf800000;
                auVar155._24_4_ = 0xbf800000;
                auVar155._28_4_ = 0xbf800000;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_360 = vfmadd132ps_avx512vl(local_220,auVar155,auVar34);
                local_220 = local_360;
                auVar104 = local_220;
                local_320 = (undefined4)lVar88;
                local_300 = local_5b0;
                uStack_2f8 = uStack_5a8;
                local_2f0 = local_5c0;
                uStack_2e8 = uStack_5b8;
                local_2e0 = local_560;
                uStack_2d8 = uStack_558;
                pGVar14 = (context->scene->geometries).items[local_668].ptr;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar82 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar82 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar118 = vaddps_avx512vl(local_4c0,_DAT_02020f40);
                  auVar94 = vcvtsi2ss_avx512f(auVar195._0_16_,local_320);
                  fVar167 = auVar94._0_4_;
                  local_2c0[0] = (fVar167 + auVar118._0_4_) * (float)local_260._0_4_;
                  local_2c0[1] = (fVar167 + auVar118._4_4_) * (float)local_260._4_4_;
                  local_2c0[2] = (fVar167 + auVar118._8_4_) * fStack_258;
                  local_2c0[3] = (fVar167 + auVar118._12_4_) * fStack_254;
                  fStack_2b0 = (fVar167 + auVar118._16_4_) * fStack_250;
                  fStack_2ac = (fVar167 + auVar118._20_4_) * fStack_24c;
                  fStack_2a8 = (fVar167 + auVar118._24_4_) * fStack_248;
                  fStack_2a4 = fVar167 + auVar118._28_4_;
                  local_220._0_8_ = local_360._0_8_;
                  local_220._8_8_ = local_360._8_8_;
                  local_220._16_8_ = local_360._16_8_;
                  local_220._24_8_ = local_360._24_8_;
                  local_2a0 = local_220._0_8_;
                  uStack_298 = local_220._8_8_;
                  uStack_290 = local_220._16_8_;
                  uStack_288 = local_220._24_8_;
                  local_280 = local_4e0;
                  local_630._8_8_ = uStack_5a8;
                  local_630._0_8_ = local_5b0;
                  uVar89 = 0;
                  uVar83 = (ulong)local_2d0;
                  for (uVar85 = uVar83; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000
                      ) {
                    uVar89 = uVar89 + 1;
                  }
                  local_1d0 = local_5c0;
                  uStack_1c8 = uStack_5b8;
                  local_1e0 = local_560;
                  uStack_1d8 = uStack_558;
                  local_620 = CONCAT44(local_620._4_4_,1);
                  local_380 = local_4c0;
                  local_340 = local_4e0;
                  local_31c = iVar13;
                  local_310 = auVar23;
                  local_220 = auVar104;
                  do {
                    local_610 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_3e0 = local_2c0[uVar89];
                    local_3d0 = *(undefined4 *)((long)&local_2a0 + uVar89 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar89 * 4);
                    local_660.context = context->user;
                    fVar146 = 1.0 - local_3e0;
                    fVar167 = fVar146 * fVar146 * -3.0;
                    auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar146)),
                                              ZEXT416((uint)(local_3e0 * fVar146)),
                                              ZEXT416(0xc0000000));
                    auVar93 = vfmsub132ss_fma(ZEXT416((uint)(local_3e0 * fVar146)),
                                              ZEXT416((uint)(local_3e0 * local_3e0)),
                                              ZEXT416(0x40000000));
                    fVar146 = auVar94._0_4_ * 3.0;
                    fVar172 = auVar93._0_4_ * 3.0;
                    fVar173 = local_3e0 * local_3e0 * 3.0;
                    auVar175._0_4_ = fVar173 * (float)local_1e0;
                    auVar175._4_4_ = fVar173 * local_1e0._4_4_;
                    auVar175._8_4_ = fVar173 * (float)uStack_1d8;
                    auVar175._12_4_ = fVar173 * uStack_1d8._4_4_;
                    auVar151._4_4_ = fVar172;
                    auVar151._0_4_ = fVar172;
                    auVar151._8_4_ = fVar172;
                    auVar151._12_4_ = fVar172;
                    auVar80._8_8_ = uStack_1c8;
                    auVar80._0_8_ = local_1d0;
                    auVar94 = vfmadd132ps_fma(auVar151,auVar175,auVar80);
                    auVar162._4_4_ = fVar146;
                    auVar162._0_4_ = fVar146;
                    auVar162._8_4_ = fVar146;
                    auVar162._12_4_ = fVar146;
                    auVar94 = vfmadd132ps_fma(auVar162,auVar94,local_630);
                    auVar152._4_4_ = fVar167;
                    auVar152._0_4_ = fVar167;
                    auVar152._8_4_ = fVar167;
                    auVar152._12_4_ = fVar167;
                    auVar94 = vfmadd213ps_fma(auVar152,auVar23,auVar94);
                    local_410 = auVar94._0_4_;
                    local_400 = vshufps_avx(auVar94,auVar94,0x55);
                    local_3f0 = vshufps_avx(auVar94,auVar94,0xaa);
                    local_3c0 = local_5e0._0_8_;
                    uStack_3b8 = local_5e0._8_8_;
                    local_3b0 = local_5d0;
                    vpcmpeqd_avx2(ZEXT1632(local_5d0),ZEXT1632(local_5d0));
                    uStack_39c = (local_660.context)->instID[0];
                    local_3a0 = uStack_39c;
                    uStack_398 = uStack_39c;
                    uStack_394 = uStack_39c;
                    uStack_390 = (local_660.context)->instPrimID[0];
                    uStack_38c = uStack_390;
                    uStack_388 = uStack_390;
                    uStack_384 = uStack_390;
                    local_680 = local_450._0_8_;
                    uStack_678 = local_450._8_8_;
                    local_660.valid = (int *)&local_680;
                    local_660.geometryUserPtr = pGVar14->userPtr;
                    local_660.hit = (RTCHitN *)&local_410;
                    local_660.N = 4;
                    pRVar81 = (RayK<4> *)pGVar14->occlusionFilterN;
                    local_5f0._0_8_ = uVar83;
                    local_600._0_8_ = uVar89;
                    uVar85 = uVar89;
                    local_660.ray = (RTCRayN *)ray;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    fStack_3dc = local_3e0;
                    fStack_3d8 = local_3e0;
                    fStack_3d4 = local_3e0;
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    if (pRVar81 != (RayK<4> *)0x0) {
                      pRVar81 = (RayK<4> *)(*(code *)pRVar81)(&local_660);
                      uVar83 = local_5f0._0_8_;
                      uVar85 = local_600._0_8_;
                    }
                    auVar75._8_8_ = uStack_678;
                    auVar75._0_8_ = local_680;
                    uVar89 = vptestmd_avx512vl(auVar75,auVar75);
                    if ((uVar89 & 0xf) != 0) {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_660);
                        uVar83 = local_5f0._0_8_;
                        uVar85 = local_600._0_8_;
                      }
                      auVar197 = auVar198._0_16_;
                      auVar76._8_8_ = uStack_678;
                      auVar76._0_8_ = local_680;
                      auVar94 = *(undefined1 (*) [16])(local_660.ray + 0x80);
                      uVar89 = vptestmd_avx512vl(auVar76,auVar76);
                      uVar89 = uVar89 & 0xf;
                      auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar16 = (bool)((byte)uVar89 & 1);
                      auVar98._0_4_ = (uint)bVar16 * auVar93._0_4_ | (uint)!bVar16 * auVar94._0_4_;
                      bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
                      auVar98._4_4_ = (uint)bVar16 * auVar93._4_4_ | (uint)!bVar16 * auVar94._4_4_;
                      bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
                      auVar98._8_4_ = (uint)bVar16 * auVar93._8_4_ | (uint)!bVar16 * auVar94._8_4_;
                      bVar16 = SUB81(uVar89 >> 3,0);
                      auVar98._12_4_ =
                           (uint)bVar16 * auVar93._12_4_ | (uint)!bVar16 * auVar94._12_4_;
                      *(undefined1 (*) [16])(local_660.ray + 0x80) = auVar98;
                      pRVar81 = (RayK<4> *)local_660.ray;
                      if ((byte)uVar89 != 0) break;
                    }
                    auVar197 = auVar198._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_610;
                    uVar89 = 0;
                    uVar83 = uVar83 ^ 1L << (uVar85 & 0x3f);
                    for (uVar85 = uVar83; (uVar85 & 1) == 0;
                        uVar85 = uVar85 >> 1 | 0x8000000000000000) {
                      uVar89 = uVar89 + 1;
                    }
                    local_620 = CONCAT44(local_620._4_4_,
                                         (int)CONCAT71((int7)((ulong)pRVar81 >> 8),uVar83 != 0));
                  } while (uVar83 != 0);
                  bVar82 = (byte)local_620 & 1;
                  auVar94 = vxorps_avx512vl(auVar197,auVar197);
                  auVar198 = ZEXT1664(auVar94);
                  in_ZMM20 = ZEXT3264(local_4c0);
                  in_ZMM21 = ZEXT3264(local_4e0);
                  auVar196 = ZEXT3264(local_480);
                  auVar190 = ZEXT3264(local_4a0);
                  auVar194 = ZEXT3264(local_5a0);
                  auVar199 = ZEXT3264(local_500);
                  auVar200 = ZEXT3264(local_520);
                }
                bVar84 = (bool)(bVar84 | bVar82);
              }
            }
          }
          auVar178 = ZEXT3264(auVar103);
          auVar157 = ZEXT3264(auVar105);
          lVar88 = lVar88 + 8;
          auVar195 = auVar190;
        } while ((int)lVar88 < iVar13);
      }
      if (bVar84 != false) {
        return local_6f9;
      }
      uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar30._4_4_ = uVar147;
      auVar30._0_4_ = uVar147;
      auVar30._8_4_ = uVar147;
      auVar30._12_4_ = uVar147;
      auVar30._16_4_ = uVar147;
      auVar30._20_4_ = uVar147;
      auVar30._24_4_ = uVar147;
      auVar30._28_4_ = uVar147;
      uVar148 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar86 = (uint)uVar87 & (uint)uVar148;
      uVar87 = (ulong)uVar86;
      local_6f9 = uVar86 != 0;
    } while (local_6f9);
  }
  return local_6f9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }